

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O2

void __thiscall miniscript_tests::fixed_tests::test_method(fixed_tests *this)

{
  Fragment FVar1;
  long lVar2;
  Node<CPubKey> *node;
  pointer psVar3;
  undefined8 uVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  vector<CPubKey,_std::allocator<CPubKey>_> *this_00;
  pointer *ppCVar8;
  CSHA256 *this_01;
  mapped_type *pmVar9;
  CRIPEMD160 *this_02;
  ulong uVar10;
  Node<CPubKey> *__args;
  ulong uVar11;
  size_t sVar12;
  uchar uVar13;
  pointer in_RSI;
  pointer __p;
  iterator in_R8;
  iterator pvVar14;
  uint opslimit;
  iterator in_R9;
  iterator pvVar15;
  uint256 *puVar16;
  long lVar17;
  long lVar18;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  Span<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> subs;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string file;
  const_string file_00;
  Span<unsigned_char> output;
  Span<unsigned_char> output_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  Span<const_unsigned_char> s_01;
  Span<const_unsigned_char> s_02;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  Span<unsigned_char> sig;
  check_type cVar19;
  char *local_800;
  char *local_7f8;
  undefined1 *local_7f0;
  undefined1 *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  undefined1 *local_7c0;
  undefined1 *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  undefined1 *local_790;
  undefined1 *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  undefined1 *local_760;
  undefined1 *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  undefined1 local_730 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_720;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  undefined1 *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  char *local_6d0;
  NodeRef<typename_KeyConverter::Key> ms_ins;
  char *local_6b8 [2];
  undefined1 *local_6a8;
  undefined1 *local_6a0;
  char *local_698;
  char *local_690;
  NodeRef<typename_KeyConverter::Key> ms_nondup;
  char *local_678 [2];
  undefined1 *local_668;
  undefined1 *local_660;
  char *local_658;
  char *local_650;
  NodeRef<typename_KeyConverter::Key> ms_dup4;
  char *local_638 [2];
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  NodeRef<typename_KeyConverter::Key> ms_dup3;
  char *local_5f8 [2];
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  char *local_5d8;
  char *local_5d0;
  NodeRef<typename_KeyConverter::Key> ms_dup2;
  char *local_5b8 [2];
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  KeyConverter wsh_converter;
  KeyConverter tap_converter;
  NodeRef<typename_KeyConverter::Key> ms_dup1;
  NodeRef<typename_KeyConverter::Key> ms_minimalif;
  NodeRef<typename_KeyConverter::Key> ms_multi;
  NodeRef<typename_KeyConverter::Key> ms_stack_nok;
  NodeRef<typename_KeyConverter::Key> ms_stack_ok;
  bool child_state;
  allocator<char> local_28d;
  array<unsigned_char,_3UL> no_pubkey;
  uchar local_289;
  char *local_288;
  char *local_280;
  CKey key;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  uint256 EMPTY_AUX;
  uint160 xonly_hash;
  CScript nonminverify_script;
  array<unsigned_char,_37UL> nonminverify;
  uchar local_1c3 [11];
  CScript nonminpush_script;
  string ms_stack_limit;
  string ms_str_multi_a;
  array<unsigned_char,_71UL> incomplete_multi_a_2;
  uchar local_109;
  array<unsigned_char,_37UL> incomplete_multi_a;
  uchar local_e3 [11];
  array<unsigned_char,_96UL> nonminpush;
  _Base_ptr local_78 [2];
  uint256 MESSAGE_HASH;
  bool local_48;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (vector<CPubKey,_std::allocator<CPubKey>_> *)operator_new(0x228);
  (this_00->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this_00->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this_00->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ppCVar8 = &this_00[1].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *(undefined4 *)
   &this_00[1].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
    ._M_finish = 0;
  this_00[1].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00[2].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)ppCVar8;
  this_00[2].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)ppCVar8;
  this_00[2].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ppCVar8 = &this_00[3].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *(undefined4 *)
   &this_00[3].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
    ._M_finish = 0;
  this_00[3].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00[4].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)ppCVar8;
  this_00[4].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)ppCVar8;
  this_00[4].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined4 *)
   &this_00[5].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
    ._M_finish = 0;
  this_00[5].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ppCVar8 = &this_00[5].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_finish;
  this_00[6].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)ppCVar8;
  this_00[6].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)ppCVar8;
  this_00[6].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ppCVar8 = &this_00[7].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *(undefined4 *)
   &this_00[7].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
    ._M_finish = 0;
  this_00[7].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00[8].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)ppCVar8;
  this_00[8].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)ppCVar8;
  this_00[8].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined4 *)
   &this_00[9].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
    ._M_finish = 0;
  ppCVar8 = &this_00[9].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_finish;
  this_00[9].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00[10].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)ppCVar8;
  this_00[10].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)ppCVar8;
  *(undefined4 *)
   &this_00[0xf].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  this_00[0xf].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  ppCVar8 = &this_00[0xf].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_finish;
  this_00[0xe].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  this_00[0xe].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  this_00[0xd].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  this_00[0xd].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  this_00[0xc].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  this_00[0xd].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  this_00[0xc].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  this_00[0xc].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  this_00[0xb].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  this_00[0xb].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  this_00[10].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00[0xb].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  this_00[0xe].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  this_00[0x10].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppCVar8;
  this_00[0x10].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)ppCVar8;
  this_00[0x10].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppCVar8 = &this_00[0x11].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *(undefined4 *)
   &this_00[0x11].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  this_00[0x11].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00[0x12].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppCVar8;
  this_00[0x12].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)ppCVar8;
  this_00[0x12].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppCVar8 = &this_00[0x13].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *(undefined4 *)
   &this_00[0x13].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  this_00[0x13].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00[0x14].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppCVar8;
  this_00[0x14].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)ppCVar8;
  this_00[0x14].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppCVar8 = &this_00[0x15].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *(undefined4 *)
   &this_00[0x15].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  this_00[0x15].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00[0x16].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppCVar8;
  this_00[0x16].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)ppCVar8;
  this_00[0x16].super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x10] = '}';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x11] = 0xe7;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x12] = 'o';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x13] = 0x8b;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x14] = 0xe1;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x15] = 0x94;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x16] = 0xcd;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x17] = 0xf5;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0] = 'e';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[1] = '\x10';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[2] = 0xa7;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[3] = 0x80;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[4] = 'l';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[5] = '5';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[6] = 0x86;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[7] = 0xbd;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[8] = 0x9c;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[9] = '\f';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[10] = '+';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xb] = '\\';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xc] = 0xe3;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xd] = 0xa9;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xe] = 0xac;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xf] = 0xd7;
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  for (iVar7 = -0xff; iVar7 != 0; iVar7 = iVar7 + 1) {
    incomplete_multi_a._M_elems[0x10] = '\0';
    incomplete_multi_a._M_elems[0x11] = '\0';
    incomplete_multi_a._M_elems[0x12] = '\0';
    incomplete_multi_a._M_elems[0x13] = '\0';
    incomplete_multi_a._M_elems[0x14] = '\0';
    incomplete_multi_a._M_elems[0x15] = '\0';
    incomplete_multi_a._M_elems[0x16] = '\0';
    incomplete_multi_a._M_elems[0x17] = '\0';
    incomplete_multi_a._M_elems[0x18] = '\0';
    incomplete_multi_a._M_elems[0x19] = '\0';
    incomplete_multi_a._M_elems[0x1a] = '\0';
    incomplete_multi_a._M_elems[0x1b] = '\0';
    incomplete_multi_a._M_elems[0x1c] = '\0';
    incomplete_multi_a._M_elems[0x1d] = '\0';
    incomplete_multi_a._M_elems[0x1e] = '\0';
    incomplete_multi_a._M_elems[0] = '\0';
    incomplete_multi_a._M_elems[1] = '\0';
    incomplete_multi_a._M_elems[2] = '\0';
    incomplete_multi_a._M_elems[3] = '\0';
    incomplete_multi_a._M_elems[4] = '\0';
    incomplete_multi_a._M_elems[5] = '\0';
    incomplete_multi_a._M_elems[6] = '\0';
    incomplete_multi_a._M_elems[7] = '\0';
    incomplete_multi_a._M_elems[8] = '\0';
    incomplete_multi_a._M_elems[9] = '\0';
    incomplete_multi_a._M_elems[10] = '\0';
    incomplete_multi_a._M_elems[0xb] = '\0';
    incomplete_multi_a._M_elems[0xc] = '\0';
    incomplete_multi_a._M_elems[0xd] = '\0';
    incomplete_multi_a._M_elems[0xe] = '\0';
    incomplete_multi_a._M_elems[0xf] = '\0';
    incomplete_multi_a._M_elems[0x1f] = (uchar)iVar7;
    key._0_8_ = key._0_8_ & 0xffffffffffffff00;
    key.keydata._M_t.
    super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
          )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            )0x0;
    CKey::Set<unsigned_char*>
              (&key,incomplete_multi_a._M_elems,incomplete_multi_a._M_elems + 0x20,true);
    CKey::GetPubKey((CPubKey *)&incomplete_multi_a_2,&key);
    CPubKey::GetID((CKeyID *)&nonminverify_script,(CPubKey *)&incomplete_multi_a_2);
    std::vector<CPubKey,_std::allocator<CPubKey>_>::push_back
              (this_00,(value_type *)&incomplete_multi_a_2);
    std::
    _Rb_tree<CPubKey,std::pair<CPubKey_const,CKeyID>,std::_Select1st<std::pair<CPubKey_const,CKeyID>>,std::less<CPubKey>,std::allocator<std::pair<CPubKey_const,CKeyID>>>
    ::_M_emplace_unique<CPubKey&,CKeyID&>
              ((_Rb_tree<CPubKey,std::pair<CPubKey_const,CKeyID>,std::_Select1st<std::pair<CPubKey_const,CKeyID>>,std::less<CPubKey>,std::allocator<std::pair<CPubKey_const,CKeyID>>>
                *)(this_00 + 1),(CPubKey *)&incomplete_multi_a_2,(CKeyID *)&nonminverify_script);
    std::
    _Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
    ::_M_emplace_unique<CKeyID&,CPubKey&>
              ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
                *)(this_00 + 3),(CKeyID *)&nonminverify_script,(CPubKey *)&incomplete_multi_a_2);
    XOnlyPubKey::XOnlyPubKey((XOnlyPubKey *)&nonminverify,(CPubKey *)&incomplete_multi_a_2);
    Hash160<XOnlyPubKey>(&xonly_hash,(XOnlyPubKey *)&nonminverify);
    std::
    _Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,CKeyID>,std::_Select1st<std::pair<XOnlyPubKey_const,CKeyID>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,CKeyID>>>
    ::_M_emplace_unique<XOnlyPubKey&,uint160&>
              ((_Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,CKeyID>,std::_Select1st<std::pair<XOnlyPubKey_const,CKeyID>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,CKeyID>>>
                *)(this_00 + 5),(XOnlyPubKey *)&nonminverify,&xonly_hash);
    std::
    _Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
    ::_M_emplace_unique<uint160&,CPubKey&>
              ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
                *)(this_00 + 3),&xonly_hash,(CPubKey *)&incomplete_multi_a_2);
    ms_str_multi_a._M_dataplus._M_p = (pointer)0x0;
    ms_str_multi_a._M_string_length = 0;
    ms_str_multi_a.field_2._M_allocated_capacity = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ms_stack_limit,0x40,
               (allocator_type *)&nonminpush);
    local_730._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
    ;
    local_730._8_8_ = "";
    local_288 = "";
    local_280 = "";
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x4f;
    file.m_begin = local_730;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_288,msg);
    _cVar19 = 0x3ac12e;
    bVar5 = CKey::Sign(&key,&MESSAGE_HASH,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ms_str_multi_a,true
                       ,0);
    nonminpush_script.super_CScriptBase._union.direct[0] = bVar5;
    nonminpush_script.super_CScriptBase._union._8_8_ = 0;
    nonminpush_script.super_CScriptBase._union._16_8_ = 0;
    ms_stack_ok.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)anon_var_dwarf_9a5a00;
    ms_stack_ok.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xba6871;
    nonminpush._M_elems._8_8_ = nonminpush._M_elems._8_8_ & 0xffffffffffffff00;
    nonminpush._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
    nonminpush._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
    nonminpush._M_elems._24_8_ = &ms_stack_ok;
    ms_stack_nok.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)anon_var_dwarf_9a4356;
    ms_stack_nok.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xba127a;
    pvVar15 = (iterator)0x0;
    pvVar14 = &DAT_00000001;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&nonminpush_script,(lazy_ostream *)&nonminpush,1,0,WARN,_cVar19,
               (size_t)&ms_stack_nok,0x4f);
    boost::detail::shared_count::~shared_count
              ((shared_count *)((long)&nonminpush_script.super_CScriptBase._union + 0x10));
    nonminpush._M_elems[0] = '\x01';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ms_str_multi_a,
               (uchar *)&nonminpush);
    std::
    _Rb_tree<CPubKey,std::pair<CPubKey_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<CPubKey_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<CPubKey>,std::allocator<std::pair<CPubKey_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
    ::_M_emplace_unique<CPubKey&,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
              ((_Rb_tree<CPubKey,std::pair<CPubKey_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<CPubKey_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<CPubKey>,std::allocator<std::pair<CPubKey_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                *)(this_00 + 7),(CPubKey *)&incomplete_multi_a_2,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ms_str_multi_a);
    ms_multi.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)anon_var_dwarf_9a4356;
    ms_multi.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xba127a;
    ms_minimalif.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)&boost::unit_test::basic_cstring<char_const>::null;
    ms_minimalif.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = pvVar15;
    msg_00.m_begin = pvVar14;
    file_00.m_end = (iterator)0x52;
    file_00.m_begin = (iterator)&ms_multi;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&ms_minimalif,
               msg_00);
    sig.m_size = ms_stack_limit._M_string_length - (long)ms_stack_limit._M_dataplus._M_p;
    _cVar19 = 0x3ac29a;
    sig.m_data = (uchar *)ms_stack_limit._M_dataplus._M_p;
    bVar5 = CKey::SignSchnorr(&key,&MESSAGE_HASH,sig,(uint256 *)0x0,&EMPTY_AUX);
    nonminpush_script.super_CScriptBase._union.direct[0] = bVar5;
    nonminpush_script.super_CScriptBase._union._8_8_ = 0;
    nonminpush_script.super_CScriptBase._union._16_8_ = 0;
    ms_stack_ok.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)anon_var_dwarf_9a5a0c;
    ms_stack_ok.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xba68b0;
    nonminpush._M_elems._8_8_ = nonminpush._M_elems._8_8_ & 0xffffffffffffff00;
    nonminpush._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
    nonminpush._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
    nonminpush._M_elems._24_8_ = &ms_stack_ok;
    ms_dup1.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)anon_var_dwarf_9a4356;
    ms_dup1.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xba127a;
    in_R9 = (iterator)0x0;
    in_R8 = &DAT_00000001;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&nonminpush_script,(lazy_ostream *)&nonminpush,1,0,WARN,_cVar19,
               (size_t)&ms_dup1,0x52);
    boost::detail::shared_count::~shared_count
              ((shared_count *)((long)&nonminpush_script.super_CScriptBase._union + 0x10));
    nonminpush._M_elems[0] = '\x01';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ms_stack_limit,
               (uchar *)&nonminpush);
    XOnlyPubKey::XOnlyPubKey((XOnlyPubKey *)&nonminpush,(CPubKey *)&incomplete_multi_a_2);
    std::
    _Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
    ::_M_emplace_unique<XOnlyPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
              ((_Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                *)(this_00 + 9),(XOnlyPubKey *)&nonminpush,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ms_stack_limit);
    nonminpush_script.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
    nonminpush_script.super_CScriptBase._union._8_8_ = 0;
    nonminpush_script.super_CScriptBase._union._16_8_ = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&nonminpush_script,0x20);
    CSHA256::CSHA256((CSHA256 *)&nonminpush);
    this_01 = CSHA256::Write((CSHA256 *)&nonminpush,incomplete_multi_a._M_elems,0x20);
    CSHA256::Finalize(this_01,(uchar *)nonminpush_script.super_CScriptBase._union.indirect_contents.
                                       indirect);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)(this_00 + 0xb),(value_type *)&nonminpush_script);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&nonminpush,
               incomplete_multi_a._M_elems,incomplete_multi_a._M_elems + 0x20,
               (allocator_type *)&ms_stack_ok);
    pmVar9 = std::
             map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ::operator[]((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           *)(this_00 + 0xf),(key_type *)&nonminpush_script);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (pmVar9,(pointer)&nonminpush);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nonminpush);
    nonminpush._M_elems[0x50] = '\0';
    nonminpush._M_elems[0x51] = '\0';
    nonminpush._M_elems[0x52] = '\0';
    nonminpush._M_elems[0x53] = '\0';
    nonminpush._M_elems[0x54] = '\0';
    nonminpush._M_elems[0x55] = '\0';
    nonminpush._M_elems[0x56] = '\0';
    nonminpush._M_elems[0x57] = '\0';
    nonminpush._M_elems[0x58] = '\0';
    nonminpush._M_elems[0x59] = '\0';
    nonminpush._M_elems[0x5a] = '\0';
    nonminpush._M_elems[0x5b] = '\0';
    nonminpush._M_elems[0x5c] = '\0';
    nonminpush._M_elems[0x5d] = '\0';
    nonminpush._M_elems[0x5e] = '\0';
    nonminpush._M_elems[0x5f] = '\0';
    nonminpush._M_elems[0x40] = '\0';
    nonminpush._M_elems[0x41] = '\0';
    nonminpush._M_elems[0x42] = '\0';
    nonminpush._M_elems[0x43] = '\0';
    nonminpush._M_elems[0x44] = '\0';
    nonminpush._M_elems[0x45] = '\0';
    nonminpush._M_elems[0x46] = '\0';
    nonminpush._M_elems[0x47] = '\0';
    nonminpush._M_elems[0x48] = '\0';
    nonminpush._M_elems[0x49] = '\0';
    nonminpush._M_elems[0x4a] = '\0';
    nonminpush._M_elems[0x4b] = '\0';
    nonminpush._M_elems[0x4c] = '\0';
    nonminpush._M_elems[0x4d] = '\0';
    nonminpush._M_elems[0x4e] = '\0';
    nonminpush._M_elems[0x4f] = '\0';
    nonminpush._M_elems[0x30] = '\0';
    nonminpush._M_elems[0x31] = '\0';
    nonminpush._M_elems[0x32] = '\0';
    nonminpush._M_elems[0x33] = '\0';
    nonminpush._M_elems[0x34] = '\0';
    nonminpush._M_elems[0x35] = '\0';
    nonminpush._M_elems[0x36] = '\0';
    nonminpush._M_elems[0x37] = '\0';
    nonminpush._M_elems[0x38] = '\0';
    nonminpush._M_elems[0x39] = '\0';
    nonminpush._M_elems[0x3a] = '\0';
    nonminpush._M_elems[0x3b] = '\0';
    nonminpush._M_elems[0x3c] = '\0';
    nonminpush._M_elems[0x3d] = '\0';
    nonminpush._M_elems[0x3e] = '\0';
    nonminpush._M_elems[0x3f] = '\0';
    nonminpush._M_elems[0x20] = '\0';
    nonminpush._M_elems[0x21] = '\0';
    nonminpush._M_elems[0x22] = '\0';
    nonminpush._M_elems[0x23] = '\0';
    nonminpush._M_elems[0x24] = '\0';
    nonminpush._M_elems[0x25] = '\0';
    nonminpush._M_elems[0x26] = '\0';
    nonminpush._M_elems[0x27] = '\0';
    nonminpush._M_elems[0x28] = '\0';
    nonminpush._M_elems[0x29] = '\0';
    nonminpush._M_elems[0x2a] = '\0';
    nonminpush._M_elems[0x2b] = '\0';
    nonminpush._M_elems[0x2c] = '\0';
    nonminpush._M_elems[0x2d] = '\0';
    nonminpush._M_elems[0x2e] = '\0';
    nonminpush._M_elems[0x2f] = '\0';
    nonminpush._M_elems[0x10] = '\0';
    nonminpush._M_elems[0x11] = '\0';
    nonminpush._M_elems[0x12] = '\0';
    nonminpush._M_elems[0x13] = '\0';
    nonminpush._M_elems[0x14] = '\0';
    nonminpush._M_elems[0x15] = '\0';
    nonminpush._M_elems[0x16] = '\0';
    nonminpush._M_elems[0x17] = '\0';
    nonminpush._M_elems[0x18] = '\0';
    nonminpush._M_elems[0x19] = '\0';
    nonminpush._M_elems[0x1a] = '\0';
    nonminpush._M_elems[0x1b] = '\0';
    nonminpush._M_elems[0x1c] = '\0';
    nonminpush._M_elems[0x1d] = '\0';
    nonminpush._M_elems[0x1e] = '\0';
    nonminpush._M_elems[0x1f] = '\0';
    nonminpush._M_elems[0] = '\0';
    nonminpush._M_elems[1] = '\0';
    nonminpush._M_elems[2] = '\0';
    nonminpush._M_elems[3] = '\0';
    nonminpush._M_elems[4] = '\0';
    nonminpush._M_elems[5] = '\0';
    nonminpush._M_elems[6] = '\0';
    nonminpush._M_elems[7] = '\0';
    nonminpush._M_elems[8] = '\0';
    nonminpush._M_elems[9] = '\0';
    nonminpush._M_elems[10] = '\0';
    nonminpush._M_elems[0xb] = '\0';
    nonminpush._M_elems[0xc] = '\0';
    nonminpush._M_elems[0xd] = '\0';
    nonminpush._M_elems[0xe] = '\0';
    nonminpush._M_elems[0xf] = '\0';
    local_78[0] = (_Base_ptr)0x0;
    CSHA256::CSHA256((CSHA256 *)&nonminpush);
    CSHA256::Write((CSHA256 *)&nonminpush,incomplete_multi_a._M_elems,0x20);
    output.m_size =
         nonminpush_script.super_CScriptBase._union._8_8_ -
         nonminpush_script.super_CScriptBase._union._0_8_;
    output.m_data = (uchar *)nonminpush_script.super_CScriptBase._union.indirect_contents.indirect;
    CHash256::Finalize((CHash256 *)&nonminpush,output);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)(this_00 + 0xd),(value_type *)&nonminpush_script);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&nonminpush,
               incomplete_multi_a._M_elems,incomplete_multi_a._M_elems + 0x20,
               (allocator_type *)&ms_stack_ok);
    pmVar9 = std::
             map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ::operator[]((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           *)(this_00 + 0x13),(key_type *)&nonminpush_script);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (pmVar9,(pointer)&nonminpush);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nonminpush);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&nonminpush_script,0x14);
    CRIPEMD160::CRIPEMD160((CRIPEMD160 *)&nonminpush);
    this_02 = CRIPEMD160::Write((CRIPEMD160 *)&nonminpush,incomplete_multi_a._M_elems,0x20);
    CRIPEMD160::Finalize
              (this_02,(uchar *)nonminpush_script.super_CScriptBase._union.indirect_contents.
                                indirect);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)(this_00 + 0xc),(value_type *)&nonminpush_script);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&nonminpush,
               incomplete_multi_a._M_elems,incomplete_multi_a._M_elems + 0x20,
               (allocator_type *)&ms_stack_ok);
    pmVar9 = std::
             map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ::operator[]((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           *)(this_00 + 0x11),(key_type *)&nonminpush_script);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (pmVar9,(pointer)&nonminpush);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nonminpush);
    nonminpush._M_elems[0x50] = '\0';
    nonminpush._M_elems[0x51] = '\0';
    nonminpush._M_elems[0x52] = '\0';
    nonminpush._M_elems[0x53] = '\0';
    nonminpush._M_elems[0x54] = '\0';
    nonminpush._M_elems[0x55] = '\0';
    nonminpush._M_elems[0x56] = '\0';
    nonminpush._M_elems[0x57] = '\0';
    nonminpush._M_elems[0x58] = '\0';
    nonminpush._M_elems[0x59] = '\0';
    nonminpush._M_elems[0x5a] = '\0';
    nonminpush._M_elems[0x5b] = '\0';
    nonminpush._M_elems[0x5c] = '\0';
    nonminpush._M_elems[0x5d] = '\0';
    nonminpush._M_elems[0x5e] = '\0';
    nonminpush._M_elems[0x5f] = '\0';
    nonminpush._M_elems[0x40] = '\0';
    nonminpush._M_elems[0x41] = '\0';
    nonminpush._M_elems[0x42] = '\0';
    nonminpush._M_elems[0x43] = '\0';
    nonminpush._M_elems[0x44] = '\0';
    nonminpush._M_elems[0x45] = '\0';
    nonminpush._M_elems[0x46] = '\0';
    nonminpush._M_elems[0x47] = '\0';
    nonminpush._M_elems[0x48] = '\0';
    nonminpush._M_elems[0x49] = '\0';
    nonminpush._M_elems[0x4a] = '\0';
    nonminpush._M_elems[0x4b] = '\0';
    nonminpush._M_elems[0x4c] = '\0';
    nonminpush._M_elems[0x4d] = '\0';
    nonminpush._M_elems[0x4e] = '\0';
    nonminpush._M_elems[0x4f] = '\0';
    nonminpush._M_elems[0x30] = '\0';
    nonminpush._M_elems[0x31] = '\0';
    nonminpush._M_elems[0x32] = '\0';
    nonminpush._M_elems[0x33] = '\0';
    nonminpush._M_elems[0x34] = '\0';
    nonminpush._M_elems[0x35] = '\0';
    nonminpush._M_elems[0x36] = '\0';
    nonminpush._M_elems[0x37] = '\0';
    nonminpush._M_elems[0x38] = '\0';
    nonminpush._M_elems[0x39] = '\0';
    nonminpush._M_elems[0x3a] = '\0';
    nonminpush._M_elems[0x3b] = '\0';
    nonminpush._M_elems[0x3c] = '\0';
    nonminpush._M_elems[0x3d] = '\0';
    nonminpush._M_elems[0x3e] = '\0';
    nonminpush._M_elems[0x3f] = '\0';
    nonminpush._M_elems[0x20] = '\0';
    nonminpush._M_elems[0x21] = '\0';
    nonminpush._M_elems[0x22] = '\0';
    nonminpush._M_elems[0x23] = '\0';
    nonminpush._M_elems[0x24] = '\0';
    nonminpush._M_elems[0x25] = '\0';
    nonminpush._M_elems[0x26] = '\0';
    nonminpush._M_elems[0x27] = '\0';
    nonminpush._M_elems[0x28] = '\0';
    nonminpush._M_elems[0x29] = '\0';
    nonminpush._M_elems[0x2a] = '\0';
    nonminpush._M_elems[0x2b] = '\0';
    nonminpush._M_elems[0x2c] = '\0';
    nonminpush._M_elems[0x2d] = '\0';
    nonminpush._M_elems[0x2e] = '\0';
    nonminpush._M_elems[0x2f] = '\0';
    nonminpush._M_elems[0x10] = '\0';
    nonminpush._M_elems[0x11] = '\0';
    nonminpush._M_elems[0x12] = '\0';
    nonminpush._M_elems[0x13] = '\0';
    nonminpush._M_elems[0x14] = '\0';
    nonminpush._M_elems[0x15] = '\0';
    nonminpush._M_elems[0x16] = '\0';
    nonminpush._M_elems[0x17] = '\0';
    nonminpush._M_elems[0x18] = '\0';
    nonminpush._M_elems[0x19] = '\0';
    nonminpush._M_elems[0x1a] = '\0';
    nonminpush._M_elems[0x1b] = '\0';
    nonminpush._M_elems[0x1c] = '\0';
    nonminpush._M_elems[0x1d] = '\0';
    nonminpush._M_elems[0x1e] = '\0';
    nonminpush._M_elems[0x1f] = '\0';
    nonminpush._M_elems[0] = '\0';
    nonminpush._M_elems[1] = '\0';
    nonminpush._M_elems[2] = '\0';
    nonminpush._M_elems[3] = '\0';
    nonminpush._M_elems[4] = '\0';
    nonminpush._M_elems[5] = '\0';
    nonminpush._M_elems[6] = '\0';
    nonminpush._M_elems[7] = '\0';
    nonminpush._M_elems[8] = '\0';
    nonminpush._M_elems[9] = '\0';
    nonminpush._M_elems[10] = '\0';
    nonminpush._M_elems[0xb] = '\0';
    nonminpush._M_elems[0xc] = '\0';
    nonminpush._M_elems[0xd] = '\0';
    nonminpush._M_elems[0xe] = '\0';
    nonminpush._M_elems[0xf] = '\0';
    local_78[0] = (_Base_ptr)0x0;
    CSHA256::CSHA256((CSHA256 *)&nonminpush);
    CSHA256::Write((CSHA256 *)&nonminpush,incomplete_multi_a._M_elems,0x20);
    output_00.m_size =
         nonminpush_script.super_CScriptBase._union._8_8_ -
         nonminpush_script.super_CScriptBase._union._0_8_;
    output_00.m_data =
         (uchar *)nonminpush_script.super_CScriptBase._union.indirect_contents.indirect;
    CHash160::Finalize((CHash160 *)&nonminpush,output_00);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)(this_00 + 0xe),(value_type *)&nonminpush_script);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&nonminpush,
               incomplete_multi_a._M_elems,incomplete_multi_a._M_elems + 0x20,
               (allocator_type *)&ms_stack_ok);
    pmVar9 = std::
             map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ::operator[]((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           *)(this_00 + 0x15),(key_type *)&nonminpush_script);
    in_RSI = (pointer)&nonminpush;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(pmVar9);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nonminpush);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nonminpush_script);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&ms_stack_limit);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&ms_str_multi_a);
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr(&key.keydata);
  }
  std::
  unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
  ::reset((unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
           *)this_00,in_RSI);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"l:older(1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,3);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"l:older(0)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"l:older(2147483647)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,3);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"l:older(2147483648)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"u:after(1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,3);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"u:after(0)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"u:after(2147483647)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,3);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"u:after(2147483648)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"andor(0,1,1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,3);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"andor(a:0,1,1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"andor(0,a:1,a:1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"andor(1,1,1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"andor(n:or_i(0,after(1)),1,1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,1);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"andor(or_i(0,after(1)),1,1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "c:andor(0,pk_k(03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7),pk_k(036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,7);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"t:andor(0,v:1,v:1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,3);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"and_v(v:1,1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,3);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"t:and_v(v:1,v:1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,3);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "c:and_v(v:1,pk_k(036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,7);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"and_v(1,1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "and_v(pk_k(02352bbf4a4cdd12564f93fa332ce333301d9ad40271f8107181340aef25be59d5),1)",
             (allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"and_v(v:1,a:1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"and_b(1,a:1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,3);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"and_b(1,1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"and_b(v:1,a:1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"and_b(a:1,a:1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "and_b(pk_k(025601570cb47f238d2b0286db4a990fa0f3ba28d1a319f5e7cf55c2a2444da7cc),a:1)",
             (allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"or_b(0,a:0)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,7);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"or_b(1,a:0)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"or_b(0,a:1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"or_b(0,0)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"or_b(v:0,a:0)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"or_b(a:0,a:0)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "or_b(pk_k(025601570cb47f238d2b0286db4a990fa0f3ba28d1a319f5e7cf55c2a2444da7cc),a:0)",
             (allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"t:or_c(0,v:1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,3);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"t:or_c(a:0,v:1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"t:or_c(1,v:1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"t:or_c(n:or_i(0,after(1)),v:1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,1);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"t:or_c(or_i(0,after(1)),v:1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"t:or_c(0,1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"or_d(0,1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,3);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"or_d(a:0,1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"or_d(1,1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"or_d(n:or_i(0,after(1)),1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,1);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"or_d(or_i(0,after(1)),1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"or_d(0,v:1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"or_i(1,1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,1);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"t:or_i(v:1,v:1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,1);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "c:or_i(pk_k(03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7),pk_k(036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,7);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"or_i(a:1,a:1)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"or_b(l:after(100),al:after(1000000000))",
             (allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,1);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"and_b(after(100),a:after(1000000000))",
             (allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"?",(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0xb);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65)",
             (allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "2103d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac",
             (allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "20d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac",
             (allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,7);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "pkh(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65)",
             (allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"76a914fcd35ddacad9f2d5be5e464639441c6065e6955d88ac",
             (allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"76a914fd1690c37fa3b0f04395ddc9415b220ab1ccc59588ac",
             (allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,7);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"lltvln:after(1231488000)",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"6300676300676300670400046749b1926869516868",
             (allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"=",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,3,0xc,3,
             (optional<unsigned_int>)0x100000003,(optional<unsigned_int>)0x100000003,
             (optional<unsigned_int>)0x100000003);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "uuj:and_v(v:multi(2,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a,025601570cb47f238d2b0286db4a990fa0f3ba28d1a319f5e7cf55c2a2444da7cc),after(1231488000))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "6363829263522103d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a21025601570cb47f238d2b0286db4a990fa0f3ba28d1a319f5e7cf55c2a2444da7cc52af0400046749b168670068670068"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0x27,0xe,5,
             (optional<unsigned_int>)0x100000097,(optional<unsigned_int>)0x100000000,
             (optional<unsigned_int>)0x100000007);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "or_b(un:multi(2,03daed4f2be3a8bf278e70132fb0beb7522f570e144bf615c07e996d443dee8729,024ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c97),al:older(16))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "63522103daed4f2be3a8bf278e70132fb0beb7522f570e144bf615c07e996d443dee872921024ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c9752ae926700686b63006760b2686c9b"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0x21,0xe,5,
             (optional<unsigned_int>)0x100000097,(optional<unsigned_int>)0x100000000,
             (optional<unsigned_int>)0x100000008);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"j:and_v(vdv:after(1567547623),older(2016))",
             (allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,"829263766304e7e06e5db169686902e007b268",
             (allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"=",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,3,0xb,1,
             (optional<unsigned_int>)0x100000002,(optional<unsigned_int>)0x100000002,
             (optional<unsigned_int>)0x100000002);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "t:and_v(vu:hash256(131772552c01444cd81360818376a040b7c3b2b7b0a53550ee3edde216cec61b),v:sha256(ec4916dd28fc4c10d78e287ca5d9cc51ee1ae73cbfde08c6b37324cbfaac8bc5))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "6382012088aa20131772552c01444cd81360818376a040b7c3b2b7b0a53550ee3edde216cec61b876700686982012088a820ec4916dd28fc4c10d78e287ca5d9cc51ee1ae73cbfde08c6b37324cbfaac8bc58851"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "6382012088aa20131772552c01444cd81360818376a040b7c3b2b7b0a53550ee3edde216cec61b876700686982012088a820ec4916dd28fc4c10d78e287ca5d9cc51ee1ae73cbfde08c6b37324cbfaac8bc58851"
             ,(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,3,0xc,3,
             (optional<unsigned_int>)0x100000044,(optional<unsigned_int>)0x100000044,
             (optional<unsigned_int>)0x100000004);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "t:andor(multi(3,02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e,03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556,02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13),v:older(4194305),v:sha256(9267d3dbed802941483f1afa2a6bc68de5f653128aca9bf1461c5d0a3ad36ed2))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "532102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e2103fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a14602975562102e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd1353ae6482012088a8209267d3dbed802941483f1afa2a6bc68de5f653128aca9bf1461c5d0a3ad36ed2886703010040b2696851"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0x23,0xd,5,
             (optional<unsigned_int>)0x1000000dc,(optional<unsigned_int>)0x100000000,
             (optional<unsigned_int>)0x10000000a);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "or_d(multi(1,02f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9),or_b(multi(3,022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01,032fa2104d6b38d11b0230010559879124e42ab8dfeff5ff29dc9cdadd4ecacc3f,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a),su:after(500000)))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "512102f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f951ae73645321022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a0121032fa2104d6b38d11b0230010559879124e42ab8dfeff5ff29dc9cdadd4ecacc3f2103d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a53ae7c630320a107b16700689b68"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0x23,0xf,7,
             (optional<unsigned_int>)0x1000000df,(optional<unsigned_int>)0x100000000,
             (optional<unsigned_int>)0x10000000a);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "or_d(sha256(38df1c1f64a24a77b23393bca50dff872e31edc4f3b5aa3b90ad0b82f4f089b6),and_n(un:after(499999999),older(4194305)))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "82012088a82038df1c1f64a24a77b23393bca50dff872e31edc4f3b5aa3b90ad0b82f4f089b68773646304ff64cd1db19267006864006703010040b26868"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "82012088a82038df1c1f64a24a77b23393bca50dff872e31edc4f3b5aa3b90ad0b82f4f089b68773646304ff64cd1db19267006864006703010040b26868"
             ,(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,1,0x10,1,
             (optional<unsigned_int>)0x100000021,(optional<unsigned_int>)0x100000021,
             (optional<unsigned_int>)0x100000003);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "and_v(or_i(v:multi(2,02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb),v:multi(2,03e60fce93b59e9ec53011aabc21c23e97b2a31369b87a5ae9c44ee89e2a6dec0a,025cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc)),sha256(d1ec675902ef1633427ca360b290b0b3045a0d9058ddb5e648b4c3c3224c5c68))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "63522102c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee52103774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb52af67522103e60fce93b59e9ec53011aabc21c23e97b2a31369b87a5ae9c44ee89e2a6dec0a21025cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc52af6882012088a820d1ec675902ef1633427ca360b290b0b3045a0d9058ddb5e648b4c3c3224c5c6887"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0x27,0xb,5,
             (optional<unsigned_int>)0x1000000b6,(optional<unsigned_int>)0x100000000,
             (optional<unsigned_int>)0x100000008);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "j:and_b(multi(2,0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798,024ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c97),s:or_i(older(1),older(4252898)))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "82926352210279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f8179821024ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c9752ae7c6351b26703e2e440b2689a68"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0x25,0xe,4,
             (optional<unsigned_int>)0x100000095,(optional<unsigned_int>)0x100000000,
             (optional<unsigned_int>)0x100000008);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "and_b(older(16),s:or_d(sha256(e38990d0c7fc009880a9c07c23842e886c6bbdc964ce6bdd5817ad357335ee6f),n:after(1567547623)))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "60b27c82012088a820e38990d0c7fc009880a9c07c23842e886c6bbdc964ce6bdd5817ad357335ee6f87736404e7e06e5db192689a"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"=",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,1,0xc,1,
             (optional<unsigned_int>)0x100000021,(optional<unsigned_int>)0x100000021,
             (optional<unsigned_int>)0x100000004);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "j:and_v(v:hash160(20195b5a3d650c17f0f29f91c33f8f6335193d07),or_d(sha256(96de8fc8c256fa1e1556d41af431cace7dca68707c78dd88c3acab8b17164c47),older(16)))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "82926382012088a91420195b5a3d650c17f0f29f91c33f8f6335193d078882012088a82096de8fc8c256fa1e1556d41af431cace7dca68707c78dd88c3acab8b17164c4787736460b26868"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"=",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,1,0x10,2,
             (optional<unsigned_int>)0x100000042,(optional<unsigned_int>)0x100000042,
             (optional<unsigned_int>)0x100000004);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "and_b(hash256(32ba476771d01e37807990ead8719f08af494723de1d228f2c2c07cc0aa40bac),a:and_b(hash256(131772552c01444cd81360818376a040b7c3b2b7b0a53550ee3edde216cec61b),a:older(1)))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "82012088aa2032ba476771d01e37807990ead8719f08af494723de1d228f2c2c07cc0aa40bac876b82012088aa20131772552c01444cd81360818376a040b7c3b2b7b0a53550ee3edde216cec61b876b51b26c9a6c9a"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"=",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,3,0xf,2,
             (optional<unsigned_int>)0x100000042,(optional<unsigned_int>)0x100000042,
             (optional<unsigned_int>)0x100000004);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "thresh(2,multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00),a:multi(1,036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00),ac:pk_k(022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "522103a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c721036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a0052ae6b5121036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a0051ae6c936b21022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01ac6c935287"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0x27,0xd,6,
             (optional<unsigned_int>)0x1000000de,(optional<unsigned_int>)0x100000000,
             (optional<unsigned_int>)0x10000000a);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "and_n(sha256(d1ec675902ef1633427ca360b290b0b3045a0d9058ddb5e648b4c3c3224c5c68),t:or_i(v:older(4252898),v:older(144)))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "82012088a820d1ec675902ef1633427ca360b290b0b3045a0d9058ddb5e648b4c3c3224c5c68876400676303e2e440b26967029000b269685168"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"=",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,1,0xe,2,
             (optional<unsigned_int>)0x100000023,(optional<unsigned_int>)0x100000023,
             (optional<unsigned_int>)0x100000004);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "or_d(nd:and_v(v:older(4252898),v:older(4252898)),sha256(38df1c1f64a24a77b23393bca50dff872e31edc4f3b5aa3b90ad0b82f4f089b6))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "766303e2e440b26903e2e440b2696892736482012088a82038df1c1f64a24a77b23393bca50dff872e31edc4f3b5aa3b90ad0b82f4f089b68768"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"=",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,1,0xf,2,
             (optional<unsigned_int>)0x100000022,(optional<unsigned_int>)0x100000022,
             (optional<unsigned_int>)0x100000003);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "c:and_v(or_c(sha256(9267d3dbed802941483f1afa2a6bc68de5f653128aca9bf1461c5d0a3ad36ed2),v:multi(1,02c44d12c7065d812e8acf28d7cbb19f9011ecd9e9fdf281b0e6a3b5e87d22e7db)),pk_k(03acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbe))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "82012088a8209267d3dbed802941483f1afa2a6bc68de5f653128aca9bf1461c5d0a3ad36ed28764512102c44d12c7065d812e8acf28d7cbb19f9011ecd9e9fdf281b0e6a3b5e87d22e7db51af682103acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbeac"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0x25,8,2,
             (optional<unsigned_int>)0x10000006a,(optional<unsigned_int>)0x100000000,
             (optional<unsigned_int>)0x100000004);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "c:and_v(or_c(multi(2,036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00,02352bbf4a4cdd12564f93fa332ce333301d9ad40271f8107181340aef25be59d5),v:ripemd160(1b0f3c404d12075c68c938f9f60ebea4f74941a0)),pk_k(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "5221036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a002102352bbf4a4cdd12564f93fa332ce333301d9ad40271f8107181340aef25be59d552ae6482012088a6141b0f3c404d12075c68c938f9f60ebea4f74941a088682103fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ac"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0x27,10,5,
             (optional<unsigned_int>)0x1000000dc,(optional<unsigned_int>)0x100000000,
             (optional<unsigned_int>)0x100000009);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "and_v(andor(hash256(8a35d9ca92a48eaade6f53a64985e9e2afeb74dcf8acb4c3721e0dc7e4294b25),v:hash256(939894f70e6c3a25da75da0cc2071b4076d9b006563cf635986ada2e93c0d735),v:older(50000)),after(499999999))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "82012088aa208a35d9ca92a48eaade6f53a64985e9e2afeb74dcf8acb4c3721e0dc7e4294b2587640350c300b2696782012088aa20939894f70e6c3a25da75da0cc2071b4076d9b006563cf635986ada2e93c0d735886804ff64cd1db1"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"=",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,1,0xe,2,
             (optional<unsigned_int>)0x100000042,(optional<unsigned_int>)0x100000042,
             (optional<unsigned_int>)0x100000004);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "andor(hash256(5f8d30e655a7ba0d7596bb3ddfb1d2d20390d23b1845000e1e118b3be1b3f040),j:and_v(v:hash160(3a2bff0da9d96868e66abc4427bea4691cf61ccd),older(4194305)),ripemd160(44d90e2d3714c8663b632fcf0f9d5f22192cc4c8))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "82012088aa205f8d30e655a7ba0d7596bb3ddfb1d2d20390d23b1845000e1e118b3be1b3f040876482012088a61444d90e2d3714c8663b632fcf0f9d5f22192cc4c8876782926382012088a9143a2bff0da9d96868e66abc4427bea4691cf61ccd8803010040b26868"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"=",(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,1,0x14,2,
             (optional<unsigned_int>)0x100000042,(optional<unsigned_int>)0x100000042,
             (optional<unsigned_int>)0x100000004);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "or_i(c:and_v(v:after(500000),pk_k(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)),sha256(d9147961436944f43cd99d28b2bbddbf452ef872b30c8279e255e7daafc7f946))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "630320a107b1692102c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5ac6782012088a820d9147961436944f43cd99d28b2bbddbf452ef872b30c8279e255e7daafc7f9468768"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "630320a107b16920c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5ac6782012088a820d9147961436944f43cd99d28b2bbddbf452ef872b30c8279e255e7daafc7f9468768"
             ,(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,3,10,2,
             (optional<unsigned_int>)0x10000004b,(optional<unsigned_int>)0x100000044,
             (optional<unsigned_int>)0x100000003);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "thresh(2,c:pk_h(025cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc),s:sha256(e38990d0c7fc009880a9c07c23842e886c6bbdc964ce6bdd5817ad357335ee6f),a:hash160(dd69735817e0e3f6f826a9238dc2e291184f0131))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "76a9145dedfbf9ea599dd4e3ca6a80b333c472fd0b3f6988ac7c82012088a820e38990d0c7fc009880a9c07c23842e886c6bbdc964ce6bdd5817ad357335ee6f87936b82012088a914dd69735817e0e3f6f826a9238dc2e291184f0131876c935287"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "76a9141a7ac36cfa8431ab2395d701b0050045ae4a37d188ac7c82012088a820e38990d0c7fc009880a9c07c23842e886c6bbdc964ce6bdd5817ad357335ee6f87936b82012088a914dd69735817e0e3f6f826a9238dc2e291184f0131876c935287"
             ,(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,1,0x12,4,
             (optional<unsigned_int>)0x100000065,(optional<unsigned_int>)0x100000064,
             (optional<unsigned_int>)0x100000006);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "and_n(sha256(9267d3dbed802941483f1afa2a6bc68de5f653128aca9bf1461c5d0a3ad36ed2),uc:and_v(v:older(144),pk_k(03fe72c435413d33d48ac09c9161ba8b09683215439d62b7940502bda8b202e6ce)))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "82012088a8209267d3dbed802941483f1afa2a6bc68de5f653128aca9bf1461c5d0a3ad36ed28764006763029000b2692103fe72c435413d33d48ac09c9161ba8b09683215439d62b7940502bda8b202e6ceac67006868"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "82012088a8209267d3dbed802941483f1afa2a6bc68de5f653128aca9bf1461c5d0a3ad36ed28764006763029000b26920fe72c435413d33d48ac09c9161ba8b09683215439d62b7940502bda8b202e6ceac67006868"
             ,(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,5,0xd,3,
             (optional<unsigned_int>)0x10000006c,(optional<unsigned_int>)0x100000065,
             (optional<unsigned_int>)0x100000005);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "and_n(c:pk_k(03daed4f2be3a8bf278e70132fb0beb7522f570e144bf615c07e996d443dee8729),and_b(l:older(4252898),a:older(16)))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "2103daed4f2be3a8bf278e70132fb0beb7522f570e144bf615c07e996d443dee8729ac64006763006703e2e440b2686b60b26c9a68"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "20daed4f2be3a8bf278e70132fb0beb7522f570e144bf615c07e996d443dee8729ac64006763006703e2e440b2686b60b26c9a68"
             ,(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0xf,0xc,2,
             (optional<unsigned_int>)0x10000004a,(optional<unsigned_int>)0x100000043,
             (optional<unsigned_int>)0x100000003);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "c:or_i(and_v(v:older(16),pk_h(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e)),pk_h(026a245bf6dc698504c89a20cfded60853152b695336c28063b61c65cbd269e6b4))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "6360b26976a9149fc5dbe5efdce10374a4dd4053c93af540211718886776a9142fbd32c8dd59ee7c17e66cb6ebea7e9846c3040f8868ac"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "6360b26976a9144d4421361c3289bdad06441ffaee8be8e786f1ad886776a91460d4a7bcbd08f58e58bd208d1069837d7adb16ae8868ac"
             ,(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,7,0xc,3,
             (optional<unsigned_int>)0x10000006d,(optional<unsigned_int>)0x100000065,
             (optional<unsigned_int>)0x100000004);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "or_d(c:pk_h(02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13),andor(c:pk_k(024ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c97),older(2016),after(1567547623)))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "76a914c42e7ef92fdb603af844d064faad95db9bcdfd3d88ac736421024ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c97ac6404e7e06e5db16702e007b26868"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "76a91421ab1a140d0d305b8ff62bdb887d9fef82c9899e88ac7364204ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c97ac6404e7e06e5db16702e007b26868"
             ,(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,3,0xd,3,
             (optional<unsigned_int>)0x10000006c,(optional<unsigned_int>)0x100000064,
             (optional<unsigned_int>)0x100000005);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "c:andor(ripemd160(6ad07d21fd5dfc646f0b30577045ce201616b9ba),pk_h(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e),and_v(v:hash256(8a35d9ca92a48eaade6f53a64985e9e2afeb74dcf8acb4c3721e0dc7e4294b25),pk_h(03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a)))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "82012088a6146ad07d21fd5dfc646f0b30577045ce201616b9ba876482012088aa208a35d9ca92a48eaade6f53a64985e9e2afeb74dcf8acb4c3721e0dc7e4294b258876a914dd100be7d9aea5721158ebde6d6a1fd8fff93bb1886776a9149fc5dbe5efdce10374a4dd4053c93af5402117188868ac"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "82012088a6146ad07d21fd5dfc646f0b30577045ce201616b9ba876482012088aa208a35d9ca92a48eaade6f53a64985e9e2afeb74dcf8acb4c3721e0dc7e4294b258876a914a63d1e4d2ed109246c600ec8c19cce546b65b1cc886776a9144d4421361c3289bdad06441ffaee8be8e786f1ad8868ac"
             ,(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,5,0x12,3,
             (optional<unsigned_int>)0x10000008c,(optional<unsigned_int>)0x100000084,
             (optional<unsigned_int>)0x100000005);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "c:andor(u:ripemd160(6ad07d21fd5dfc646f0b30577045ce201616b9ba),pk_h(03daed4f2be3a8bf278e70132fb0beb7522f570e144bf615c07e996d443dee8729),or_i(pk_h(022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01),pk_h(0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798)))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "6382012088a6146ad07d21fd5dfc646f0b30577045ce201616b9ba87670068646376a9149652d86bedf43ad264362e6e6eba6eb764508127886776a914751e76e8199196d454941c45d1b3a323f1433bd688686776a91420d637c1a6404d2227f3561fdbaff5a680dba6488868ac"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "6382012088a6146ad07d21fd5dfc646f0b30577045ce201616b9ba87670068646376a914ceedcb44b38bdbcb614d872223964fd3dca8a434886776a914f678d9b79045452c8c64e9309d0f0046056e26c588686776a914a2a75e1819afa208f6c89ae0da43021116dfcb0c8868ac"
             ,(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,5,0x17,4,
             (optional<unsigned_int>)0x10000008e,(optional<unsigned_int>)0x100000086,
             (optional<unsigned_int>)0x100000005);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "c:or_i(andor(c:pk_h(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),pk_h(022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01),pk_h(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)),pk_k(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "6376a914fcd35ddacad9f2d5be5e464639441c6065e6955d88ac6476a91406afd46bcdfd22ef94ac122aa11f241244a37ecc886776a9149652d86bedf43ad264362e6e6eba6eb7645081278868672102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e68ac"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "6376a914fd1690c37fa3b0f04395ddc9415b220ab1ccc59588ac6476a9149b652a14674a506079f574d20ca7daef6f9a66bb886776a914ceedcb44b38bdbcb614d872223964fd3dca8a43488686720d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e68ac"
             ,(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,7,0x11,5,
             (optional<unsigned_int>)0x1000000d8,(optional<unsigned_int>)0x1000000c8,
             (optional<unsigned_int>)0x100000006);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "thresh(1,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),altv:after(1000000000),altv:after(100))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "2103d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac6b6300670400ca9a3bb16951686c936b6300670164b16951686c935187"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "20d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac6b6300670400ca9a3bb16951686c936b6300670164b16951686c935187"
             ,(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,1,0x12,3,
             (optional<unsigned_int>)0x10000004d,(optional<unsigned_int>)0x100000046,
             (optional<unsigned_int>)0x100000004);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "thresh(2,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),ac:pk_k(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556),altv:after(1000000000),altv:after(100))"
             ,(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&incomplete_multi_a_2,
             "2103d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac6b2103fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ac6c936b6300670400ca9a3bb16951686c936b6300670164b16951686c935287"
             ,(allocator<char> *)&incomplete_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "20d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac6b20fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ac6c936b6300670400ca9a3bb16951686c936b6300670164b16951686c935287"
             ,(allocator<char> *)&nonminverify);
  pvVar14 = (iterator)0xb;
  pvVar15 = (iterator)0x16;
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,
             (string *)&incomplete_multi_a_2,(string *)&MESSAGE_HASH,0xb,0x16,4,
             (optional<unsigned_int>)0x100000096,(optional<unsigned_int>)0x100000088,
             (optional<unsigned_int>)0x100000005);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&incomplete_multi_a_2);
  std::__cxx11::string::~string((string *)&nonminpush);
  wsh_converter.m_script_ctx = P2WSH;
  tap_converter.m_script_ctx = TAPSCRIPT;
  no_pubkey._M_elems[2] = 0x9c;
  no_pubkey._M_elems[0] = 0xac;
  no_pubkey._M_elems[1] = 'Q';
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar15;
  msg_01.m_begin = pvVar14;
  file_01.m_end = (iterator)0x25a;
  file_01.m_begin = (iterator)&local_2f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_308,
             msg_01);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector<const_unsigned_char_*>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&nonminpush,no_pubkey._M_elems,
             &local_289);
  _cVar19 = 0x3aff90;
  miniscript::FromScript<(anonymous_namespace)::KeyConverter>
            ((miniscript *)&EMPTY_AUX,(CScript *)&nonminpush,&tap_converter);
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  incomplete_multi_a._M_elems._0_8_ = anon_var_dwarf_9a542b;
  incomplete_multi_a._M_elems._8_8_ =
       (long)
       "miniscript::FromScript({no_pubkey.begin(), no_pubkey.end()}, tap_converter) == nullptr" +
       0x56;
  incomplete_multi_a_2._M_elems[8] = '\0';
  incomplete_multi_a_2._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  incomplete_multi_a_2._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_310 = "";
  pvVar14 = &DAT_00000001;
  pvVar15 = (iterator)0x0;
  incomplete_multi_a_2._M_elems._24_8_ = (allocator<char> *)&incomplete_multi_a;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0] =
       EMPTY_AUX.super_base_blob<256U>.m_data._M_elems._0_8_ == 0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&MESSAGE_HASH,(lazy_ostream *)&incomplete_multi_a_2,1,0,WARN,
             _cVar19,(size_t)&local_318,0x25a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (EMPTY_AUX.super_base_blob<256U>.m_data._M_elems + 8));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&nonminpush);
  incomplete_multi_a._M_elems[0x10] = '|';
  incomplete_multi_a._M_elems[0x11] = 0xd8;
  incomplete_multi_a._M_elems[0x12] = '\\';
  incomplete_multi_a._M_elems[0x13] = 'w';
  incomplete_multi_a._M_elems[0x14] = 0x8e;
  incomplete_multi_a._M_elems[0x15] = 'K';
  incomplete_multi_a._M_elems[0x16] = 0x8c;
  incomplete_multi_a._M_elems[0x17] = 0xef;
  incomplete_multi_a._M_elems[0x18] = '<';
  incomplete_multi_a._M_elems[0x19] = 0xa7;
  incomplete_multi_a._M_elems[0x1a] = 0xab;
  incomplete_multi_a._M_elems[0x1b] = 0xac;
  incomplete_multi_a._M_elems[0x1c] = '\t';
  incomplete_multi_a._M_elems[0] = 0xba;
  incomplete_multi_a._M_elems[1] = ' ';
  incomplete_multi_a._M_elems[2] = 0xc6;
  incomplete_multi_a._M_elems[3] = '\x04';
  incomplete_multi_a._M_elems[4] = '\x7f';
  incomplete_multi_a._M_elems[5] = 0x94;
  incomplete_multi_a._M_elems[6] = 'A';
  incomplete_multi_a._M_elems[7] = 0xed;
  incomplete_multi_a._M_elems[8] = '}';
  incomplete_multi_a._M_elems[9] = 'm';
  incomplete_multi_a._M_elems[10] = '0';
  incomplete_multi_a._M_elems[0xb] = 'E';
  incomplete_multi_a._M_elems[0xc] = '@';
  incomplete_multi_a._M_elems[0xd] = 'n';
  incomplete_multi_a._M_elems[0xe] = 0x95;
  incomplete_multi_a._M_elems[0xf] = 0xc0;
  incomplete_multi_a._M_elems[0x1d] = 0xb9;
  incomplete_multi_a._M_elems[0x1e] = '\\';
  incomplete_multi_a._M_elems[0x1f] = 'p';
  incomplete_multi_a._M_elems[0x20] = 0x9e;
  incomplete_multi_a._M_elems[0x21] = 0xe5;
  incomplete_multi_a._M_elems[0x22] = 0xba;
  incomplete_multi_a._M_elems[0x23] = 'Q';
  incomplete_multi_a._M_elems[0x24] = 0x9c;
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar15;
  msg_02.m_begin = pvVar14;
  file_02.m_end = (iterator)0x25c;
  file_02.m_begin = (iterator)&local_328;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_338,
             msg_02);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector<const_unsigned_char_*>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&nonminpush,
             incomplete_multi_a._M_elems,local_e3);
  _cVar19 = 0x3b00e3;
  miniscript::FromScript<(anonymous_namespace)::KeyConverter>
            ((miniscript *)&EMPTY_AUX,(CScript *)&nonminpush,&tap_converter);
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0] =
       EMPTY_AUX.super_base_blob<256U>.m_data._M_elems._0_8_ == 0;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  nonminverify._M_elems._0_8_ = anon_var_dwarf_9a5446;
  nonminverify._M_elems._8_8_ =
       (long)
       "miniscript::FromScript({incomplete_multi_a.begin(), incomplete_multi_a.end()}, tap_converter) == nullptr"
       + 0x68;
  incomplete_multi_a_2._M_elems[8] = '\0';
  incomplete_multi_a_2._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  incomplete_multi_a_2._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_340 = "";
  pvVar14 = &DAT_00000001;
  pvVar15 = (iterator)0x0;
  incomplete_multi_a_2._M_elems._24_8_ = (allocator<char> *)&nonminverify;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&MESSAGE_HASH,(lazy_ostream *)&incomplete_multi_a_2,1,0,WARN,
             _cVar19,(size_t)&local_348,0x25c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (EMPTY_AUX.super_base_blob<256U>.m_data._M_elems + 8));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&nonminpush);
  memcpy(&incomplete_multi_a_2,&DAT_00ba0f8c,0x47);
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar15;
  msg_03.m_begin = pvVar14;
  file_03.m_end = (iterator)0x25e;
  file_03.m_begin = (iterator)&local_358;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_368,
             msg_03);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector<const_unsigned_char_*>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&nonminpush,
             incomplete_multi_a_2._M_elems,&local_109);
  _cVar19 = 0x3b0236;
  miniscript::FromScript<(anonymous_namespace)::KeyConverter>
            ((miniscript *)&nonminverify,(CScript *)&nonminpush,&tap_converter);
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0] = nonminverify._M_elems._0_8_ == 0;
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ms_str_multi_a._M_dataplus._M_p =
       "miniscript::FromScript({incomplete_multi_a_2.begin(), incomplete_multi_a_2.end()}, tap_converter) == nullptr"
  ;
  ms_str_multi_a._M_string_length =
       (long)
       "miniscript::FromScript({incomplete_multi_a_2.begin(), incomplete_multi_a_2.end()}, tap_converter) == nullptr"
       + 0x6c;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ =
       MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_370 = "";
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._24_8_ = &ms_str_multi_a;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&EMPTY_AUX,(lazy_ostream *)&MESSAGE_HASH,1,0,WARN,_cVar19,
             (size_t)&local_378,0x25e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(EMPTY_AUX.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(nonminverify._M_elems + 8));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "and_v(v:multi_a(2,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a,025601570cb47f238d2b0286db4a990fa0f3ba28d1a319f5e7cf55c2a2444da7cc),after(1231488000))"
             ,(allocator<char> *)&nonminverify);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&ms_str_multi_a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&EMPTY_AUX,
             "20d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85aac205601570cb47f238d2b0286db4a990fa0f3ba28d1a319f5e7cf55c2a2444da7ccba529d0400046749b1"
             ,(allocator<char> *)&ms_stack_limit);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,(string *)&MESSAGE_HASH
             ,(string *)&EMPTY_AUX,0x17,4,2,(optional<unsigned_int>)0x0,(optional<unsigned_int>)0x0,
             (optional<unsigned_int>)0x100000003);
  std::__cxx11::string::~string((string *)&EMPTY_AUX);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ms_str_multi_a,"multi_a(1,",(allocator<char> *)&nonminpush);
  for (lVar17 = 0; lVar17 != 0x555; lVar17 = lVar17 + 0x41) {
    bVar6 = *(byte *)(*(anonymous_namespace)::g_testdata + lVar17);
    sVar12 = 0x21;
    if ((bVar6 & 0xfe) != 2) {
      bVar6 = bVar6 - 4;
      if (bVar6 < 4) {
        sVar12 = *(size_t *)(&DAT_00b5ace0 + (ulong)bVar6 * 8);
      }
      else {
        sVar12 = 0;
      }
    }
    s.m_data = (uchar *)(*(anonymous_namespace)::g_testdata + lVar17);
    s.m_size = sVar12;
    HexStr_abi_cxx11_((string *)&nonminpush,s);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&ms_str_multi_a,(string *)&nonminpush);
    std::__cxx11::string::~string((string *)&nonminpush);
    if (lVar17 != 0x514) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&ms_str_multi_a,",");
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&ms_str_multi_a,")");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"?",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "2079be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798ac20c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5ba20f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9ba20e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13ba202f8bde4d1a07209355b4a7250a5c5128e88b84bddc619ab7cba8d569b240efe4ba20fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ba205cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bcba202f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01ba20acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbeba20a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7ba20774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cbba20d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85aba20f28773c2d975288bc7d1d205c3748651b075fbc6610e58cddeeddf8f19405aa8ba20499fdf9e895e719cfd64e67f07d38e3226aa7b63678949e6e49b241a60e823e4ba20d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080eba20e60fce93b59e9ec53011aabc21c23e97b2a31369b87a5ae9c44ee89e2a6dec0aba20defdea4cdb677750a420fee807eacf21eb9898ae79b9768766e4faa04a2d4a34ba205601570cb47f238d2b0286db4a990fa0f3ba28d1a319f5e7cf55c2a2444da7ccba202b4ea0a797a443d293ef5cff444f4979f06acfebd7e86d277475656138385b6cba204ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c97ba20352bbf4a4cdd12564f93fa332ce333301d9ad40271f8107181340aef25be59d5ba519c"
             ,(allocator<char> *)&nonminverify);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&ms_str_multi_a,(string *)&nonminpush,
             (string *)&MESSAGE_HASH,0x17,0x16,0x15,(optional<unsigned_int>)0x0,
             (optional<unsigned_int>)0x0,(optional<unsigned_int>)0x100000016);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,
             "thresh(2,dv:older(42),s:pk(025cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc),s:pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65))"
             ,(allocator<char> *)&nonminverify);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&ms_stack_limit);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&EMPTY_AUX,
             "7663012ab269687c205cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bcac937c20d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac935287"
             ,(allocator<char> *)&nonminpush_script);
  pvVar14 = (iterator)0x17;
  pvVar15 = (iterator)0xc;
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&nonminpush,(string *)&MESSAGE_HASH
             ,(string *)&EMPTY_AUX,0x17,0xc,3,(optional<unsigned_int>)0x0,
             (optional<unsigned_int>)0x0,(optional<unsigned_int>)0x100000004);
  std::__cxx11::string::~string((string *)&EMPTY_AUX);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&nonminpush);
  ms_stack_limit._M_dataplus._M_p = (pointer)0x6e00000063;
  ms_stack_limit._M_string_length = CONCAT44(ms_stack_limit._M_string_length._4_4_,200);
  for (lVar17 = 0; lVar17 != 0xc; lVar17 = lVar17 + 4) {
    iVar7 = *(int *)((long)&ms_stack_limit._M_dataplus._M_p + lVar17);
    nonminpush._M_elems._0_8_ = nonminpush._M_elems + 0x10;
    nonminpush._M_elems[8] = '\0';
    nonminpush._M_elems[9] = '\0';
    nonminpush._M_elems[10] = '\0';
    nonminpush._M_elems[0xb] = '\0';
    nonminpush._M_elems[0xc] = '\0';
    nonminpush._M_elems[0xd] = '\0';
    nonminpush._M_elems[0xe] = '\0';
    nonminpush._M_elems[0xf] = '\0';
    nonminpush._M_elems._16_8_ = nonminpush._M_elems._16_8_ & 0xffffffffffffff00;
    uVar11 = (long)iVar7 - 1;
    uVar10 = 0;
    if (0 < (int)uVar11) {
      uVar10 = uVar11 & 0xffffffff;
    }
    for (lVar18 = 0; uVar10 * 0x41 - lVar18 != 0; lVar18 = lVar18 + 0x41) {
      bVar6 = *(byte *)(*(anonymous_namespace)::g_testdata + lVar18);
      sVar12 = 0x21;
      if ((bVar6 & 0xfe) != 2) {
        bVar6 = bVar6 - 4;
        if (bVar6 < 4) {
          sVar12 = *(size_t *)(&DAT_00b5ace0 + (ulong)bVar6 * 8);
        }
        else {
          sVar12 = 0;
        }
      }
      s_00.m_data = (uchar *)(*(anonymous_namespace)::g_testdata + lVar18);
      s_00.m_size = sVar12;
      HexStr_abi_cxx11_((string *)&nonminverify,s_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&EMPTY_AUX
                     ,"and_b(pk(",(string *)&nonminverify);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &MESSAGE_HASH,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&EMPTY_AUX
                     ,"),a:");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nonminpush,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&MESSAGE_HASH)
      ;
      std::__cxx11::string::~string((string *)&MESSAGE_HASH);
      std::__cxx11::string::~string((string *)&EMPTY_AUX);
      std::__cxx11::string::~string((string *)&nonminverify);
    }
    bVar6 = *(byte *)(*(anonymous_namespace)::g_testdata + uVar11 * 0x41);
    sVar12 = 0x21;
    if ((bVar6 & 0xfe) != 2) {
      bVar6 = bVar6 - 4;
      if (bVar6 < 4) {
        sVar12 = *(size_t *)(&DAT_00b5ace0 + (ulong)bVar6 * 8);
      }
      else {
        sVar12 = 0;
      }
    }
    s_01.m_data = (uchar *)(*(anonymous_namespace)::g_testdata + uVar11 * 0x41);
    s_01.m_size = sVar12;
    HexStr_abi_cxx11_((string *)&nonminverify,s_01);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&EMPTY_AUX,
                   "pk(",(string *)&nonminverify);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &MESSAGE_HASH,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&EMPTY_AUX,
                   ")");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nonminpush,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&MESSAGE_HASH);
    std::__cxx11::string::~string((string *)&MESSAGE_HASH);
    std::__cxx11::string::~string((string *)&EMPTY_AUX);
    std::__cxx11::string::~string((string *)&nonminverify);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nonminpush,
               (char *)(nonminpush._M_elems._0_8_ + nonminpush._M_elems._8_8_),uVar11,')');
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&EMPTY_AUX,"?",(allocator<char> *)&nonminpush_script);
    opslimit = (int)uVar11 * 3 + iVar7;
    pvVar15 = (iterator)(ulong)opslimit;
    pvVar14 = (iterator)0x17;
    anon_unknown.dwarf_9a1342::MiniScriptTest::Test
              (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nonminpush,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&MESSAGE_HASH,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&EMPTY_AUX,0x17,
               opslimit,iVar7,(optional<unsigned_int>)0x0,(optional<unsigned_int>)0x0,
               (optional<unsigned_int>)((ulong)(iVar7 + 1) | 0x100000000));
    std::__cxx11::string::~string((string *)&EMPTY_AUX);
    std::__cxx11::string::~string((string *)&MESSAGE_HASH);
    std::__cxx11::string::~string((string *)&nonminpush);
  }
  ms_stack_limit._M_dataplus._M_p = (pointer)&ms_stack_limit.field_2;
  ms_stack_limit._M_string_length = 0;
  ms_stack_limit.field_2._M_local_buf[0] = '\0';
  iVar7 = 0x3e6;
  while (bVar5 = iVar7 != 0, iVar7 = iVar7 + -1, bVar5) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&ms_stack_limit,"and_b(older(1),a:");
  }
  bVar6 = *(byte *)*(anonymous_namespace)::g_testdata;
  if ((bVar6 & 0xfe) == 2) {
    sVar12 = 0x21;
  }
  else {
    bVar6 = bVar6 - 4;
    if (bVar6 < 4) {
      sVar12 = *(size_t *)(&DAT_00b5ace0 + (ulong)bVar6 * 8);
    }
    else {
      sVar12 = 0;
    }
  }
  s_02.m_size = sVar12;
  s_02.m_data = (byte *)*(anonymous_namespace)::g_testdata;
  HexStr_abi_cxx11_((string *)&EMPTY_AUX,s_02);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&MESSAGE_HASH,
                 "pk(",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &EMPTY_AUX);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nonminpush,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&MESSAGE_HASH,
                 ")");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&ms_stack_limit,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nonminpush);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&EMPTY_AUX);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
            (&ms_stack_limit,
             (const_iterator)(ms_stack_limit._M_dataplus._M_p + ms_stack_limit._M_string_length),
             0x3e6,')');
  miniscript::FromString<(anonymous_namespace)::KeyConverter>
            ((string *)&ms_stack_ok,(KeyConverter *)&ms_stack_limit);
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar19 = 0x3b09b0;
  msg_04.m_end = pvVar15;
  msg_04.m_begin = pvVar14;
  file_04.m_end = (iterator)0x27f;
  file_04.m_begin = (iterator)&local_388;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_398,
             msg_04);
  if (ms_stack_ok.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    bVar5 = false;
  }
  else {
    _cVar19 = 0x3b09c2;
    bVar5 = miniscript::Node<CPubKey>::CheckStackSize
                      (ms_stack_ok.
                       super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
  }
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0] = bVar5;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_9a555f;
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"ms_stack_ok && ms_stack_ok->CheckStackSize()" + 0x2c;
  nonminpush._M_elems._8_8_ = nonminpush._M_elems._8_8_ & 0xffffffffffffff00;
  nonminpush._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  nonminpush._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_3a0 = "";
  nonminpush._M_elems._24_8_ = (string *)&EMPTY_AUX;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&MESSAGE_HASH,(lazy_ostream *)&nonminpush,1,0,WARN,_cVar19,
             (size_t)&local_3a8,0x27f);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"?",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  pvVar14 = (iterator)0x17;
  pvVar15 = (iterator)0xf99;
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&ms_stack_limit,(string *)&nonminpush,
             (string *)&MESSAGE_HASH,0x17,0xf99,1,(optional<unsigned_int>)0x0,
             (optional<unsigned_int>)0x0,(optional<unsigned_int>)0x1000003e8);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&MESSAGE_HASH,
                 "and_b(older(1),a:",&ms_stack_limit);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nonminpush,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&MESSAGE_HASH,
                 ")");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&ms_stack_limit,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nonminpush);
  std::__cxx11::string::~string((string *)&nonminpush);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  miniscript::FromString<(anonymous_namespace)::KeyConverter>
            ((string *)&ms_stack_nok,(KeyConverter *)&ms_stack_limit);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar19 = 0x3b0bc4;
  msg_05.m_end = pvVar15;
  msg_05.m_begin = pvVar14;
  file_05.m_end = (iterator)0x285;
  file_05.m_begin = (iterator)&local_3b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_3c8,
             msg_05);
  if (ms_stack_nok.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    bVar5 = false;
  }
  else {
    _cVar19 = 0x3b0bde;
    bVar5 = miniscript::Node<CPubKey>::CheckStackSize
                      (ms_stack_nok.
                       super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    bVar5 = !bVar5;
  }
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0] = bVar5;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_9a557a;
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"ms_stack_nok && !ms_stack_nok->CheckStackSize()" + 0x2f;
  nonminpush._M_elems._8_8_ = nonminpush._M_elems._8_8_ & 0xffffffffffffff00;
  nonminpush._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  nonminpush._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_3d0 = "";
  nonminpush._M_elems._24_8_ = (allocator<char> *)&EMPTY_AUX;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&MESSAGE_HASH,(lazy_ostream *)&nonminpush,1,0,WARN,_cVar19,
             (size_t)&local_3d8,0x285);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nonminpush,"?",(allocator<char> *)&EMPTY_AUX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"?",(allocator<char> *)&nonminverify);
  pvVar14 = (iterator)0x17;
  pvVar15 = (iterator)0xf9d;
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&ms_stack_limit,(string *)&nonminpush,
             (string *)&MESSAGE_HASH,0x17,0xf9d,1,(optional<unsigned_int>)0x0,
             (optional<unsigned_int>)0x0,(optional<unsigned_int>)0x1000003e9);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&nonminpush);
  memcpy(&nonminpush,&DAT_00ba0fd3,0x60);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector<const_unsigned_char_*>
            (&nonminpush_script.super_CScriptBase,nonminpush._M_elems,(uchar *)local_78);
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar15;
  msg_06.m_begin = pvVar14;
  file_06.m_end = (iterator)0x28c;
  file_06.m_begin = (iterator)&local_3e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3f8,
             msg_06);
  _cVar19 = 0x3b0da7;
  miniscript::FromScript<(anonymous_namespace)::KeyConverter>
            ((miniscript *)&nonminverify,&nonminpush_script,&wsh_converter);
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  nonminverify_script.super_CScriptBase._union.indirect_contents.indirect =
       "miniscript::FromScript(nonminpush_script, wsh_converter) == nullptr";
  nonminverify_script.super_CScriptBase._union._8_8_ =
       (long)"miniscript::FromScript(nonminpush_script, wsh_converter) == nullptr" + 0x43;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ =
       MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._24_8_ = &nonminverify_script;
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_400 = "";
  pvVar14 = &DAT_00000001;
  pvVar15 = (iterator)0x0;
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0] = nonminverify._M_elems._0_8_ == 0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&EMPTY_AUX,(lazy_ostream *)&MESSAGE_HASH,1,0,WARN,_cVar19,
             (size_t)&local_408,0x28c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(EMPTY_AUX.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(nonminverify._M_elems + 8));
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar15;
  msg_07.m_begin = pvVar14;
  file_07.m_end = (iterator)0x28d;
  file_07.m_begin = (iterator)&local_418;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_428,
             msg_07);
  _cVar19 = 0x3b0ea7;
  miniscript::FromScript<(anonymous_namespace)::KeyConverter>
            ((miniscript *)&nonminverify,&nonminpush_script,&tap_converter);
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0] = nonminverify._M_elems._0_8_ == 0;
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  nonminverify_script.super_CScriptBase._union.indirect_contents.indirect =
       "miniscript::FromScript(nonminpush_script, tap_converter) == nullptr";
  nonminverify_script.super_CScriptBase._union._8_8_ =
       (long)"miniscript::FromScript(nonminpush_script, tap_converter) == nullptr" + 0x43;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ =
       MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._24_8_ = &nonminverify_script;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_430 = "";
  pvVar14 = &DAT_00000001;
  pvVar15 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&EMPTY_AUX,(lazy_ostream *)&MESSAGE_HASH,1,0,WARN,_cVar19,
             (size_t)&local_438,0x28d);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(EMPTY_AUX.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(nonminverify._M_elems + 8));
  nonminverify._M_elems[0x10] = 0xae;
  nonminverify._M_elems[0x11] = ']';
  nonminverify._M_elems[0x12] = '4';
  nonminverify._M_elems[0x13] = 'B';
  nonminverify._M_elems[0x14] = 0xd4;
  nonminverify._M_elems[0x15] = 0x9b;
  nonminverify._M_elems[0x16] = '\x19';
  nonminverify._M_elems[0x17] = 'C';
  nonminverify._M_elems[0x18] = 0xc2;
  nonminverify._M_elems[0x19] = 0xb7;
  nonminverify._M_elems[0x1a] = 'R';
  nonminverify._M_elems[0x1b] = 0xa6;
  nonminverify._M_elems[0x1c] = 0x8e;
  nonminverify._M_elems[0] = '!';
  nonminverify._M_elems[1] = '\x03';
  nonminverify._M_elems[2] = 0xa0;
  nonminverify._M_elems[3] = 'C';
  nonminverify._M_elems[4] = 'M';
  nonminverify._M_elems[5] = 0x9e;
  nonminverify._M_elems[6] = 'G';
  nonminverify._M_elems[7] = 0xf3;
  nonminverify._M_elems[8] = 200;
  nonminverify._M_elems[9] = 'b';
  nonminverify._M_elems[10] = '5';
  nonminverify._M_elems[0xb] = 'G';
  nonminverify._M_elems[0xc] = '|';
  nonminverify._M_elems[0xd] = '{';
  nonminverify._M_elems[0xe] = '\x1a';
  nonminverify._M_elems[0xf] = 0xe6;
  nonminverify._M_elems[0x1d] = '*';
  nonminverify._M_elems[0x1e] = 'G';
  nonminverify._M_elems[0x1f] = 0xe2;
  nonminverify._M_elems[0x20] = 'G';
  nonminverify._M_elems[0x21] = 199;
  nonminverify._M_elems[0x22] = 0xac;
  nonminverify._M_elems[0x23] = 'i';
  nonminverify._M_elems[0x24] = 'Q';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector<const_unsigned_char_*>
            (&nonminverify_script.super_CScriptBase,nonminverify._M_elems,local_1c3);
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar15;
  msg_08.m_begin = pvVar14;
  file_08.m_end = (iterator)0x291;
  file_08.m_begin = (iterator)&local_448;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_458,
             msg_08);
  _cVar19 = 0x3b0ff2;
  miniscript::FromScript<(anonymous_namespace)::KeyConverter>
            ((miniscript *)&xonly_hash,&nonminverify_script,&wsh_converter);
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0] =
       xonly_hash.super_base_blob<160U>.m_data._M_elems._0_8_ == 0;
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  key._0_8_ = anon_var_dwarf_9a55bd;
  key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )((long)"miniscript::FromScript(nonminverify_script, wsh_converter) == nullptr" + 0x45);
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ =
       MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_460 = "";
  pvVar14 = &DAT_00000001;
  pvVar15 = (iterator)0x0;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._24_8_ = &key;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&EMPTY_AUX,(lazy_ostream *)&MESSAGE_HASH,1,0,WARN,_cVar19,
             (size_t)&local_468,0x291);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(EMPTY_AUX.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (xonly_hash.super_base_blob<160U>.m_data._M_elems + 8));
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar15;
  msg_09.m_begin = pvVar14;
  file_09.m_end = (iterator)0x292;
  file_09.m_begin = (iterator)&local_478;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_488,
             msg_09);
  _cVar19 = 0x3b10ea;
  miniscript::FromScript<(anonymous_namespace)::KeyConverter>
            ((miniscript *)&xonly_hash,&nonminverify_script,&tap_converter);
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0] =
       xonly_hash.super_base_blob<160U>.m_data._M_elems._0_8_ == 0;
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  key._0_8_ = anon_var_dwarf_9a55d8;
  key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )((long)"miniscript::FromScript(nonminverify_script, tap_converter) == nullptr" + 0x45);
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ =
       MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_490 = "";
  pvVar15 = (iterator)0x0;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._24_8_ = &key;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&EMPTY_AUX,(lazy_ostream *)&MESSAGE_HASH,1,0,WARN,_cVar19,
             (size_t)&local_498,0x292);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(EMPTY_AUX.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (xonly_hash.super_base_blob<160U>.m_data._M_elems + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "thresh(2,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),altv:after(100))"
             ,(allocator<char> *)&key);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&EMPTY_AUX,
             "2103d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac6b6300670164b16951686c935287"
             ,(allocator<char> *)local_730);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&xonly_hash,
             "20d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac6b6300670164b16951686c935287"
             ,(allocator<char> *)&local_288);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&MESSAGE_HASH,(string *)&EMPTY_AUX,
             (string *)&xonly_hash,7);
  std::__cxx11::string::~string((string *)&xonly_hash);
  std::__cxx11::string::~string((string *)&EMPTY_AUX);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "thresh(1,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),sc:pk_k(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556))"
             ,(allocator<char> *)&key);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&EMPTY_AUX,
             "2103d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac7c2103fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ac935187"
             ,(allocator<char> *)local_730);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&xonly_hash,
             "20d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac7c20fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ac935187"
             ,(allocator<char> *)&local_288);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&MESSAGE_HASH,(string *)&EMPTY_AUX,
             (string *)&xonly_hash,7);
  std::__cxx11::string::~string((string *)&xonly_hash);
  std::__cxx11::string::~string((string *)&EMPTY_AUX);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "thresh(3,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),sc:pk_k(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556))"
             ,(allocator<char> *)&key);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&EMPTY_AUX,
             "2103d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac7c2103fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ac935187"
             ,(allocator<char> *)local_730);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&xonly_hash,"=",(allocator<char> *)&local_288);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&MESSAGE_HASH,(string *)&EMPTY_AUX,
             (string *)&xonly_hash,0);
  std::__cxx11::string::~string((string *)&xonly_hash);
  std::__cxx11::string::~string((string *)&EMPTY_AUX);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "thresh(0,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),sc:pk_k(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556))"
             ,(allocator<char> *)&key);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&EMPTY_AUX,
             "2103d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac7c2103fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ac935187"
             ,(allocator<char> *)local_730);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&xonly_hash,"=",(allocator<char> *)&local_288);
  pvVar14 = (iterator)0x0;
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&MESSAGE_HASH,(string *)&EMPTY_AUX,
             (string *)&xonly_hash,0);
  std::__cxx11::string::~string((string *)&xonly_hash);
  std::__cxx11::string::~string((string *)&EMPTY_AUX);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "multi(1,03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65,03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556,0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798)"
             ,(allocator<char> *)&EMPTY_AUX);
  miniscript::FromString<(anonymous_namespace)::KeyConverter>
            ((string *)&ms_multi,(KeyConverter *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  local_4a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar19 = 0x3b1488;
  msg_10.m_end = pvVar15;
  msg_10.m_begin = pvVar14;
  file_10.m_end = (iterator)0x29d;
  file_10.m_begin = (iterator)&local_4a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_4b8,
             msg_10);
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0] =
       ms_multi.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr != (element_type *)0x0;
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  xonly_hash.super_base_blob<160U>.m_data._M_elems._0_8_ = (long)"with_params_multi" + 9;
  xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ = (long)"with_params_multi" + 0x11;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ =
       MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._24_8_ = &xonly_hash;
  local_4c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_4c0 = "";
  pvVar14 = &DAT_00000001;
  pvVar15 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&EMPTY_AUX,(lazy_ostream *)&MESSAGE_HASH,1,0,WARN,_cVar19,
             (size_t)&local_4c8,0x29d);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(EMPTY_AUX.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar15;
  msg_11.m_begin = pvVar14;
  file_11.m_end = (iterator)0x29e;
  file_11.m_begin = (iterator)&local_4d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_4e8,
             msg_11);
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ =
       MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_4f0 = "";
  uVar11 = (ulong)((ms_multi.
                    super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->ops).sat.valid;
  uVar10 = (ulong)(((ms_multi.
                     super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->ops).sat.value +
                  ((ms_multi.
                    super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->ops).count);
  if (uVar11 == 0) {
    uVar10 = 0;
  }
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems._0_8_ = uVar10 | uVar11 << 0x20;
  puVar16 = &EMPTY_AUX;
  xonly_hash.super_base_blob<160U>.m_data._M_elems[0] = '\x04';
  xonly_hash.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  xonly_hash.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  xonly_hash.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  pvVar14 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&MESSAGE_HASH,&local_4f8,0x29e,1,2,puVar16,"*ms_multi->GetOps()",&xonly_hash,"4");
  local_508 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = (iterator)puVar16;
  msg_12.m_begin = pvVar14;
  file_12.m_end = (iterator)0x29f;
  file_12.m_begin = (iterator)&local_508;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_518,
             msg_12);
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ =
       MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_528 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_520 = "";
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems._0_8_ =
       miniscript::Node<CPubKey>::GetStackSize
                 (ms_multi.
                  super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr);
  puVar16 = &EMPTY_AUX;
  xonly_hash.super_base_blob<160U>.m_data._M_elems[0] = '\x02';
  xonly_hash.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  xonly_hash.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  xonly_hash.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  pvVar14 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&MESSAGE_HASH,&local_528,0x29f,1,2,puVar16,"*ms_multi->GetStackSize()",&xonly_hash,"2")
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "thresh(3,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),sc:pk_k(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556),sc:pk_k(0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798),sdv:older(32))"
             ,(allocator<char> *)&EMPTY_AUX);
  miniscript::FromString<(anonymous_namespace)::KeyConverter>
            ((string *)&ms_minimalif,(KeyConverter *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  local_538 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_530 = "";
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar19 = 0x3b175b;
  msg_13.m_end = (iterator)puVar16;
  msg_13.m_begin = pvVar14;
  file_13.m_end = (iterator)0x2a8;
  file_13.m_begin = (iterator)&local_538;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_548,
             msg_13);
  if (ms_minimalif.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    bVar5 = false;
  }
  else {
    _cVar19 = 0x3b176d;
    bVar5 = miniscript::Node<CPubKey>::IsValid
                      (ms_minimalif.
                       super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    bVar5 = !bVar5;
  }
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  xonly_hash.super_base_blob<160U>.m_data._M_elems._0_8_ = anon_var_dwarf_9a5741;
  xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ =
       (long)"ms_minimalif && !ms_minimalif->IsValid()" + 0x28;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ =
       MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_558 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_550 = "";
  pvVar14 = &DAT_00000001;
  pvVar15 = (iterator)0x0;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._24_8_ = &xonly_hash;
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0] = bVar5;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&EMPTY_AUX,(lazy_ostream *)&MESSAGE_HASH,1,0,WARN,_cVar19,
             (size_t)&local_558,0x2a8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(EMPTY_AUX.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "and_v(v:pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65))"
             ,(allocator<char> *)&EMPTY_AUX);
  miniscript::FromString<(anonymous_namespace)::KeyConverter>
            ((string *)&ms_dup1,(KeyConverter *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar19 = 0x3b187d;
  msg_14.m_end = pvVar15;
  msg_14.m_begin = pvVar14;
  file_14.m_end = (iterator)0x2ab;
  file_14.m_begin = (iterator)&local_568;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_578,
             msg_14);
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0] =
       ms_dup1.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr != (element_type *)0x0;
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  xonly_hash.super_base_blob<160U>.m_data._M_elems._0_8_ = anon_var_dwarf_9a5769;
  xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ = (long)"ms_dup1" + 7;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ =
       MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._24_8_ = &xonly_hash;
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_580 = "";
  pvVar14 = &DAT_00000001;
  pvVar15 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&EMPTY_AUX,(lazy_ostream *)&MESSAGE_HASH,1,0,WARN,_cVar19,
             (size_t)&local_588,0x2ab);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(EMPTY_AUX.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_598 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_590 = "";
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = pvVar15;
  msg_15.m_begin = pvVar14;
  file_15.m_end = (iterator)0x2ac;
  file_15.m_begin = (iterator)&local_598;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_5a8,
             msg_15);
  _cVar19 = 0x3b1965;
  bVar5 = miniscript::Node<CPubKey>::IsSane
                    (ms_dup1.
                     super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  if (bVar5) {
    EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  }
  else {
    EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
    if (((ms_dup1.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
        super__Optional_payload_base<bool>._M_engaged != false) {
      EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0] =
           ((ms_dup1.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
           super__Optional_payload_base<bool>._M_payload._M_value;
    }
  }
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  xonly_hash.super_base_blob<160U>.m_data._M_elems._0_8_ = anon_var_dwarf_9a5784;
  xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ =
       (long)"!ms_dup1->IsSane() && !ms_dup1->CheckDuplicateKey()" + 0x33;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ =
       MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_5b8[0] = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_5b8[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
                         + 0x69);
  pvVar14 = &DAT_00000001;
  pvVar15 = (iterator)0x0;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._24_8_ = &xonly_hash;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&EMPTY_AUX,(lazy_ostream *)&MESSAGE_HASH,1,0,WARN,_cVar19,
             (size_t)local_5b8,0x2ac);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(EMPTY_AUX.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "or_b(c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),ac:pk_h(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65))"
             ,(allocator<char> *)&EMPTY_AUX);
  miniscript::FromString<(anonymous_namespace)::KeyConverter>
            ((string *)&ms_dup2,(KeyConverter *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  local_5d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_5d0 = "";
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar19 = 0x3b1aa8;
  msg_16.m_end = pvVar15;
  msg_16.m_begin = pvVar14;
  file_16.m_end = (iterator)0x2af;
  file_16.m_begin = (iterator)&local_5d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_5e8,
             msg_16);
  if (ms_dup2.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
LAB_003b1abe:
    uVar13 = '\0';
  }
  else {
    _cVar19 = 0x3b1aba;
    bVar5 = miniscript::Node<CPubKey>::IsSane
                      (ms_dup2.
                       super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (bVar5) goto LAB_003b1abe;
    uVar13 = '\x01';
    if (((ms_dup2.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
        super__Optional_payload_base<bool>._M_engaged != false) {
      uVar13 = ((ms_dup2.
                 super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool>._M_payload._M_value;
    }
  }
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0] = uVar13;
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  xonly_hash.super_base_blob<160U>.m_data._M_elems._0_8_ = anon_var_dwarf_9a57ac;
  xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ =
       (long)"ms_dup2 && !ms_dup2->IsSane() && !ms_dup2->CheckDuplicateKey()" + 0x3e;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ =
       MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_5f8[0] = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_5f8[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
                         + 0x69);
  pvVar14 = &DAT_00000001;
  pvVar15 = (iterator)0x0;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._24_8_ = &xonly_hash;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&EMPTY_AUX,(lazy_ostream *)&MESSAGE_HASH,1,0,WARN,_cVar19,
             (size_t)local_5f8,0x2af);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(EMPTY_AUX.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "or_i(and_b(pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),s:pk(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556)),and_b(older(1),s:pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65)))"
             ,(allocator<char> *)&EMPTY_AUX);
  miniscript::FromString<(anonymous_namespace)::KeyConverter>
            ((string *)&ms_dup3,(KeyConverter *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  local_618 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_610 = "";
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar19 = 0x3b1bf5;
  msg_17.m_end = pvVar15;
  msg_17.m_begin = pvVar14;
  file_17.m_end = (iterator)0x2b2;
  file_17.m_begin = (iterator)&local_618;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_628,
             msg_17);
  if (ms_dup3.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
LAB_003b1c0b:
    uVar13 = '\0';
  }
  else {
    _cVar19 = 0x3b1c07;
    bVar5 = miniscript::Node<CPubKey>::IsSane
                      (ms_dup3.
                       super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (bVar5) goto LAB_003b1c0b;
    uVar13 = '\x01';
    if (((ms_dup3.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
        super__Optional_payload_base<bool>._M_engaged != false) {
      uVar13 = ((ms_dup3.
                 super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool>._M_payload._M_value;
    }
  }
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0] = uVar13;
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  xonly_hash.super_base_blob<160U>.m_data._M_elems._0_8_ = anon_var_dwarf_9a57e2;
  xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ =
       (long)"ms_dup3 && !ms_dup3->IsSane() && !ms_dup3->CheckDuplicateKey()" + 0x3e;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ =
       MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_638[0] = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_638[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
                         + 0x69);
  pvVar14 = &DAT_00000001;
  pvVar15 = (iterator)0x0;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._24_8_ = &xonly_hash;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&EMPTY_AUX,(lazy_ostream *)&MESSAGE_HASH,1,0,WARN,_cVar19,
             (size_t)local_638,0x2b2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(EMPTY_AUX.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "thresh(2,pkh(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),s:pk(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556),a:and_b(dv:older(1),s:pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65)))"
             ,(allocator<char> *)&EMPTY_AUX);
  miniscript::FromString<(anonymous_namespace)::KeyConverter>
            ((string *)&ms_dup4,(KeyConverter *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  local_658 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_650 = "";
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar19 = 0x3b1d42;
  msg_18.m_end = pvVar15;
  msg_18.m_begin = pvVar14;
  file_18.m_end = (iterator)0x2b5;
  file_18.m_begin = (iterator)&local_658;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_668,
             msg_18);
  if (ms_dup4.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
LAB_003b1d58:
    uVar13 = '\0';
  }
  else {
    _cVar19 = 0x3b1d54;
    bVar5 = miniscript::Node<CPubKey>::IsSane
                      (ms_dup4.
                       super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (bVar5) goto LAB_003b1d58;
    uVar13 = '\x01';
    if (((ms_dup4.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
        super__Optional_payload_base<bool>._M_engaged != false) {
      uVar13 = ((ms_dup4.
                 super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool>._M_payload._M_value;
    }
  }
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0] = uVar13;
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  xonly_hash.super_base_blob<160U>.m_data._M_elems._0_8_ = anon_var_dwarf_9a580a;
  xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ =
       (long)"ms_dup4 && !ms_dup4->IsSane() && !ms_dup4->CheckDuplicateKey()" + 0x3e;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ =
       MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_678[0] = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_678[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
                         + 0x69);
  pvVar14 = &DAT_00000001;
  pvVar15 = (iterator)0x0;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._24_8_ = &xonly_hash;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&EMPTY_AUX,(lazy_ostream *)&MESSAGE_HASH,1,0,WARN,_cVar19,
             (size_t)local_678,0x2b5);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(EMPTY_AUX.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65)",
             (allocator<char> *)&EMPTY_AUX);
  miniscript::FromString<(anonymous_namespace)::KeyConverter>
            ((string *)&ms_nondup,(KeyConverter *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  local_698 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_690 = "";
  local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar19 = 0x3b1e86;
  msg_19.m_end = pvVar15;
  msg_19.m_begin = pvVar14;
  file_19.m_end = (iterator)0x2b8;
  file_19.m_begin = (iterator)&local_698;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_6a8,
             msg_19);
  bVar5 = false;
  if (((ms_nondup.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) &&
      (bVar5 = false,
      ((ms_nondup.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == true)) &&
     ((((ms_nondup.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
       super__Optional_payload_base<bool>._M_payload._M_value & 1U) == 0)) {
    _cVar19 = 0x3b1eac;
    bVar5 = miniscript::Node<CPubKey>::IsSane
                      (ms_nondup.
                       super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
  }
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0] = bVar5;
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  xonly_hash.super_base_blob<160U>.m_data._M_elems._0_8_ = anon_var_dwarf_9a5817;
  xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ =
       (long)"ms_nondup && ms_nondup->CheckDuplicateKey() && ms_nondup->IsSane()" + 0x42;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ =
       MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_6b8[0] = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_6b8[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
                         + 0x69);
  pvVar14 = &DAT_00000001;
  pvVar15 = (iterator)0x0;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._24_8_ = &xonly_hash;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&EMPTY_AUX,(lazy_ostream *)&MESSAGE_HASH,1,0,WARN,_cVar19,
             (size_t)local_6b8,0x2b8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(EMPTY_AUX.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "or_i(and_b(after(1),a:after(1000000000)),pk(03cdabb7f2dce7bfbd8a0b9570c6fd1e712e5d64045e9d6b517b3d5072251dc204))"
             ,(allocator<char> *)&EMPTY_AUX);
  miniscript::FromString<(anonymous_namespace)::KeyConverter>
            ((string *)&ms_ins,(KeyConverter *)&MESSAGE_HASH);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  local_6d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_6d0 = "";
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar19 = 0x3b1fb9;
  msg_20.m_end = pvVar15;
  msg_20.m_begin = pvVar14;
  file_20.m_end = (iterator)0x2bf;
  file_20.m_begin = (iterator)&local_6d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_6e8,
             msg_20);
  if (ms_ins.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    _cVar19 = 0x3b1fcb;
    bVar5 = miniscript::Node<CPubKey>::IsValid
                      (ms_ins.
                       super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (bVar5) {
      _cVar19 = 0x3b1fdc;
      bVar5 = miniscript::Node<CPubKey>::IsSane
                        (ms_ins.
                         super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      bVar5 = !bVar5;
      goto LAB_003b1fe2;
    }
  }
  bVar5 = false;
LAB_003b1fe2:
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0] = bVar5;
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  EMPTY_AUX.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  xonly_hash.super_base_blob<160U>.m_data._M_elems._0_8_ = anon_var_dwarf_9a584d;
  xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ =
       (long)"ms_ins && ms_ins->IsValid() && !ms_ins->IsSane()" + 0x30;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ =
       MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_6f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_6f0 = "";
  pvVar14 = &DAT_00000001;
  pvVar15 = (iterator)0x0;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._24_8_ = &xonly_hash;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&EMPTY_AUX,(lazy_ostream *)&MESSAGE_HASH,1,0,WARN,_cVar19,
             (size_t)&local_6f8,0x2bf);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(EMPTY_AUX.super_base_blob<256U>.m_data._M_elems + 0x10));
  __args = miniscript::Node<CPubKey>::
           TreeEval<miniscript::Node<CPubKey>const*,miniscript::Node<CPubKey>::FindInsaneSub()const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::Node<CPubKey>const*>)_1_>
                     (ms_ins.
                      super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
  local_708 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_700 = "";
  aStack_720._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar19 = 0x3b20b8;
  msg_21.m_end = pvVar15;
  msg_21.m_begin = pvVar14;
  file_21.m_end = (iterator)0x2c1;
  file_21.m_begin = (iterator)&local_708;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,
             (size_t)(local_730 + 0x18),msg_21);
  if (__args == (Node<CPubKey> *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = miniscript::IsTapscript(__args->m_script_ctx);
    local_280 = (char *)CONCAT71(local_280._1_7_,bVar5);
    local_28d = (allocator<char>)0x0;
    xonly_hash.super_base_blob<160U>.m_data._M_elems[0] = '\0';
    xonly_hash.super_base_blob<160U>.m_data._M_elems[1] = '\0';
    xonly_hash.super_base_blob<160U>.m_data._M_elems[2] = '\0';
    xonly_hash.super_base_blob<160U>.m_data._M_elems[3] = '\0';
    xonly_hash.super_base_blob<160U>.m_data._M_elems[4] = '\0';
    xonly_hash.super_base_blob<160U>.m_data._M_elems[5] = '\0';
    xonly_hash.super_base_blob<160U>.m_data._M_elems[6] = '\0';
    xonly_hash.super_base_blob<160U>.m_data._M_elems[7] = '\0';
    xonly_hash.super_base_blob<160U>.m_data._M_elems[8] = '\0';
    xonly_hash.super_base_blob<160U>.m_data._M_elems[9] = '\0';
    xonly_hash.super_base_blob<160U>.m_data._M_elems[10] = '\0';
    xonly_hash.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
    xonly_hash.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
    xonly_hash.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
    xonly_hash.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
    xonly_hash.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
    stack0xfffffffffffffde8 = (undefined1 *)0x0;
    key.fCompressed = false;
    key._1_7_ = 0;
    key.keydata._M_t.
    super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
          )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            )0x0;
    local_268._M_allocated_capacity = 0;
    MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._0_8_ =
         MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._0_8_ & 0xffffffff00000000;
    local_288 = (char *)&wsh_converter;
    std::
    vector<miniscript::Node<CPubKey>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(bool,miniscript::Node<CPubKey>const&,unsigned_long)#1},miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(bool,miniscript::Node<CPubKey>const&,Span<std::__cxx11::string>)#1}>(bool,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(bool,miniscript::Node<CPubKey>const&,unsigned_long)#1},miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(bool,miniscript::Node<CPubKey>const&,Span<std::__cxx11::string>)#1})const::StackElem,std::allocator<miniscript::Node<CPubKey>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(bool,miniscript::Node<CPubKey>const&,unsigned_long)#1},miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(bool,miniscript::Node<CPubKey>const&,Span<std::__cxx11::string>)#1}>(bool,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(bool,miniscript::Node<CPubKey>const&,unsigned_long)#1},miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(bool,miniscript::Node<CPubKey>const&,Span<std::__cxx11::string>)#1})const::StackElem>>
    ::emplace_back<miniscript::Node<CPubKey>const&,int,bool>
              ((vector<miniscript::Node<CPubKey>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(bool,miniscript::Node<CPubKey>const&,unsigned_long)_1_,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(bool,miniscript::Node<CPubKey>const&,Span<std::__cxx11::string>)_1_>(bool,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(bool,miniscript::Node<CPubKey>const&,unsigned_long)_1_,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(bool,miniscript::Node<CPubKey>const&,Span<std::__cxx11::string>)_1_)const::StackElem,std::allocator<miniscript::Node<CPubKey>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(bool,miniscript::Node<CPubKey>const&,unsigned_long)_1_,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(bool,miniscript::Node<CPubKey>const&,Span<std::__cxx11::string>)_1_>(bool,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(bool,miniscript::Node<CPubKey>const&,unsigned_long)_1_,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(bool,miniscript::Node<CPubKey>const&,Span<std::__cxx11::string>)_1_)const::StackElem>>
                *)&xonly_hash,__args,(int *)&MESSAGE_HASH,(bool *)&local_28d);
    while (uVar4 = xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_,
          xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ !=
          xonly_hash.super_base_blob<160U>.m_data._M_elems._0_8_) {
      node = *(Node<CPubKey> **)(xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ + -0x18);
      uVar10 = *(ulong *)(xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ + -0x10);
      psVar3 = (node->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      subs.m_size = (long)(node->subs).
                          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4;
      if (uVar10 < subs.m_size) {
        *(ulong *)(xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ + -0x10) = uVar10 + 1;
        FVar1 = node->fragment;
        child_state = true;
        if (6 < FVar1 - WRAP_A) {
          if (FVar1 == OR_I) {
            if (((psVar3->
                 super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->fragment != 0) {
              child_state = (psVar3[1].
                             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->fragment == 0;
            }
          }
          else if (FVar1 == AND_V) {
            child_state = (psVar3[1].
                           super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->fragment == 1;
          }
          else {
            child_state = false;
          }
        }
        MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._0_8_ =
             MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._0_8_ & 0xffffffff00000000;
        std::
        vector<miniscript::Node<CPubKey>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(bool,miniscript::Node<CPubKey>const&,unsigned_long)#1},miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(bool,miniscript::Node<CPubKey>const&,Span<std::__cxx11::string>)#1}>(bool,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(bool,miniscript::Node<CPubKey>const&,unsigned_long)#1},miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(bool,miniscript::Node<CPubKey>const&,Span<std::__cxx11::string>)#1})const::StackElem,std::allocator<miniscript::Node<CPubKey>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(bool,miniscript::Node<CPubKey>const&,unsigned_long)#1},miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(bool,miniscript::Node<CPubKey>const&,Span<std::__cxx11::string>)#1}>(bool,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(bool,miniscript::Node<CPubKey>const&,unsigned_long)#1},miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(bool,miniscript::Node<CPubKey>const&,Span<std::__cxx11::string>)#1})const::StackElem>>
        ::emplace_back<miniscript::Node<CPubKey>const&,int,bool>
                  ((vector<miniscript::Node<CPubKey>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(bool,miniscript::Node<CPubKey>const&,unsigned_long)_1_,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(bool,miniscript::Node<CPubKey>const&,Span<std::__cxx11::string>)_1_>(bool,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(bool,miniscript::Node<CPubKey>const&,unsigned_long)_1_,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(bool,miniscript::Node<CPubKey>const&,Span<std::__cxx11::string>)_1_)const::StackElem,std::allocator<miniscript::Node<CPubKey>::TreeEvalMaybe<std::__cxx11::string,bool,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(bool,miniscript::Node<CPubKey>const&,unsigned_long)_1_,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(bool,miniscript::Node<CPubKey>const&,Span<std::__cxx11::string>)_1_>(bool,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(bool,miniscript::Node<CPubKey>const&,unsigned_long)_1_,miniscript::Node<CPubKey>::ToString<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(bool,miniscript::Node<CPubKey>const&,Span<std::__cxx11::string>)_1_)const::StackElem>>
                    *)&xonly_hash,
                   psVar3[uVar10].
                   super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(int *)&MESSAGE_HASH,&child_state);
      }
      else {
        if ((ulong)((long)key.keydata._M_t.
                          super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                          .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                          _M_head_impl - key._0_8_ >> 5) < subs.m_size) {
          __assert_fail("results.size() >= node.subs.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x273,
                        "std::optional<Result> miniscript::Node<CPubKey>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = CPubKey, Result = std::basic_string<char>, State = bool, DownFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:809:23), UpFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:821:21)]"
                       );
        }
        subs.m_data = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (key._0_8_ +
                       ((long)key.keydata._M_t.
                              super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                              .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                              _M_head_impl - key._0_8_) + subs.m_size * -0x20);
        const::{lambda(bool,miniscript::Node<CPubKey>const&,Span<std::__cxx11::string>)#1}::
        operator()::string_>__const
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&MESSAGE_HASH,&local_288,
                   *(bool *)(xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ + -8),node,subs)
        ;
        if (local_48 == false) {
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&MESSAGE_HASH);
          goto LAB_003b2300;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&key,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)key.keydata._M_t.
                               super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                               _M_head_impl +
                        ((long)(node->subs).
                               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(node->subs).
                              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) * -2),
                (const_iterator)
                key.keydata._M_t.
                super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&key,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &MESSAGE_HASH);
        xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ = uVar4 + -0x18;
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&MESSAGE_HASH);
      }
    }
    if ((long)key.keydata._M_t.
              super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
              .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl -
        key._0_8_ != 0x20) {
      __assert_fail("results.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                    ,0x27e,
                    "std::optional<Result> miniscript::Node<CPubKey>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = CPubKey, Result = std::basic_string<char>, State = bool, DownFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:809:23), UpFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:821:21)]"
                   );
    }
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&EMPTY_AUX,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)key._0_8_);
LAB_003b2300:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&key);
    std::vector<StackElem,_std::allocator<StackElem>_>::~vector
              ((vector<StackElem,_std::allocator<StackElem>_> *)&xonly_hash);
    _cVar19 = 0x3b233e;
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &EMPTY_AUX,"and_b(after(1),a:after(1000000000))");
  }
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._24_8_ = &xonly_hash;
  local_730[0] = bVar5;
  local_730._8_8_ = (element_type *)0x0;
  aStack_720._M_allocated_capacity = 0;
  xonly_hash.super_base_blob<160U>.m_data._M_elems._0_8_ = anon_var_dwarf_9a5883;
  xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ =
       (long)
       "insane_sub && *insane_sub->ToString(wsh_converter) == \"and_b(after(1),a:after(1000000000))\""
       + 0x5b;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ =
       MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  MESSAGE_HASH.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_740 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_738 = "";
  pvVar14 = &DAT_00000001;
  pvVar15 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_730,(lazy_ostream *)&MESSAGE_HASH,1,0,WARN,_cVar19,
             (size_t)&local_740,0x2c1);
  boost::detail::shared_count::~shared_count((shared_count *)(local_730 + 0x10));
  if (__args != (Node<CPubKey> *)0x0) {
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&EMPTY_AUX);
  }
  local_750 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_748 = "";
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_22.m_end = pvVar15;
  msg_22.m_begin = pvVar14;
  file_22.m_end = (iterator)0x2c4;
  file_22.m_begin = (iterator)&local_750;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_760,
             msg_22);
  std::__cxx11::string::string<std::allocator<char>>((string *)&MESSAGE_HASH,"after(-1)",&local_28d)
  ;
  _cVar19 = 0x3b2450;
  miniscript::FromString<(anonymous_namespace)::KeyConverter>
            ((string *)local_730,(KeyConverter *)&MESSAGE_HASH);
  key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  local_268._M_allocated_capacity = 0;
  local_288 = "!miniscript::FromString(\"after(-1)\", wsh_converter)";
  local_280 = "";
  xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ =
       xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  xonly_hash.super_base_blob<160U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  stack0xfffffffffffffde8 = boost::unit_test::lazy_ostream::inst;
  local_770 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_768 = "";
  pvVar14 = &DAT_00000001;
  pvVar15 = (iterator)0x0;
  key.fCompressed = (pointer)local_730._0_8_ == (pointer)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&key,(lazy_ostream *)&xonly_hash,1,0,WARN,_cVar19,
             (size_t)&local_770,0x2c4);
  boost::detail::shared_count::~shared_count((shared_count *)&local_268._M_allocated_capacity);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_730 + 8));
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  local_780 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_778 = "";
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_23.m_end = pvVar15;
  msg_23.m_begin = pvVar14;
  file_23.m_end = (iterator)0x2c5;
  file_23.m_begin = (iterator)&local_780;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_790,
             msg_23);
  std::__cxx11::string::string<std::allocator<char>>((string *)&MESSAGE_HASH,"after(+1)",&local_28d)
  ;
  _cVar19 = 0x3b2571;
  miniscript::FromString<(anonymous_namespace)::KeyConverter>
            ((string *)local_730,(KeyConverter *)&MESSAGE_HASH);
  key.fCompressed = (pointer)local_730._0_8_ == (pointer)0x0;
  key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  local_268._M_allocated_capacity = 0;
  local_288 = "!miniscript::FromString(\"after(+1)\", wsh_converter)";
  local_280 = "";
  xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ =
       xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  xonly_hash.super_base_blob<160U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  stack0xfffffffffffffde8 = boost::unit_test::lazy_ostream::inst;
  local_7a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_798 = "";
  pvVar14 = &DAT_00000001;
  pvVar15 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&key,(lazy_ostream *)&xonly_hash,1,0,WARN,_cVar19,
             (size_t)&local_7a0,0x2c5);
  boost::detail::shared_count::~shared_count((shared_count *)&local_268._M_allocated_capacity);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_730 + 8));
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  local_7b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_7a8 = "";
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_24.m_end = pvVar15;
  msg_24.m_begin = pvVar14;
  file_24.m_end = (iterator)0x2c6;
  file_24.m_begin = (iterator)&local_7b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_7c0,
             msg_24);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "thresh(-1,pk(03cdabb7f2dce7bfbd8a0b9570c6fd1e712e5d64045e9d6b517b3d5072251dc204))",
             &local_28d);
  _cVar19 = 0x3b2692;
  miniscript::FromString<(anonymous_namespace)::KeyConverter>
            ((string *)local_730,(KeyConverter *)&MESSAGE_HASH);
  key.fCompressed = (pointer)local_730._0_8_ == (pointer)0x0;
  key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  local_268._M_allocated_capacity = 0;
  local_288 = 
  "!miniscript::FromString(\"thresh(-1,pk(03cdabb7f2dce7bfbd8a0b9570c6fd1e712e5d64045e9d6b517b3d5072251dc204))\", wsh_converter)"
  ;
  local_280 = "";
  xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ =
       xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  xonly_hash.super_base_blob<160U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  stack0xfffffffffffffde8 = boost::unit_test::lazy_ostream::inst;
  local_7d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_7c8 = "";
  pvVar14 = &DAT_00000001;
  pvVar15 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&key,(lazy_ostream *)&xonly_hash,1,0,WARN,_cVar19,
             (size_t)&local_7d0,0x2c6);
  boost::detail::shared_count::~shared_count((shared_count *)&local_268._M_allocated_capacity);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_730 + 8));
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  local_7e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_7d8 = "";
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_25.m_end = pvVar15;
  msg_25.m_begin = pvVar14;
  file_25.m_end = (iterator)0x2c7;
  file_25.m_begin = (iterator)&local_7e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_7f0,
             msg_25);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "multi(+1,03cdabb7f2dce7bfbd8a0b9570c6fd1e712e5d64045e9d6b517b3d5072251dc204)",
             &local_28d);
  _cVar19 = 0x3b27b3;
  miniscript::FromString<(anonymous_namespace)::KeyConverter>
            ((string *)local_730,(KeyConverter *)&MESSAGE_HASH);
  key.fCompressed = (pointer)local_730._0_8_ == (pointer)0x0;
  key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  local_268._M_allocated_capacity = 0;
  local_288 = 
  "!miniscript::FromString(\"multi(+1,03cdabb7f2dce7bfbd8a0b9570c6fd1e712e5d64045e9d6b517b3d5072251dc204)\", wsh_converter)"
  ;
  local_280 = "";
  xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ =
       xonly_hash.super_base_blob<160U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  xonly_hash.super_base_blob<160U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  stack0xfffffffffffffde8 = boost::unit_test::lazy_ostream::inst;
  local_800 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniscript_tests.cpp"
  ;
  local_7f8 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&key,(lazy_ostream *)&xonly_hash,1,0,WARN,_cVar19,
             (size_t)&local_800,0x2c7);
  boost::detail::shared_count::~shared_count((shared_count *)&local_268._M_allocated_capacity);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_730 + 8));
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"after(100)",(allocator<char> *)local_730);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&xonly_hash,"?",(allocator<char> *)&local_288);
  std::__cxx11::string::string<std::allocator<char>>((string *)&key,"?",&local_28d);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&MESSAGE_HASH,(string *)&xonly_hash
             ,(string *)&key,3);
  std::__cxx11::string::~string((string *)&key);
  std::__cxx11::string::~string((string *)&xonly_hash);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"after(1000000000)",(allocator<char> *)local_730);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&xonly_hash,"?",(allocator<char> *)&local_288);
  std::__cxx11::string::string<std::allocator<char>>((string *)&key,"?",&local_28d);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&MESSAGE_HASH,(string *)&xonly_hash
             ,(string *)&key,3);
  std::__cxx11::string::~string((string *)&key);
  std::__cxx11::string::~string((string *)&xonly_hash);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"or_b(l:after(100),al:after(1000000000))",
             (allocator<char> *)local_730);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&xonly_hash,"?",(allocator<char> *)&local_288);
  std::__cxx11::string::string<std::allocator<char>>((string *)&key,"?",&local_28d);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&MESSAGE_HASH,(string *)&xonly_hash
             ,(string *)&key,1);
  std::__cxx11::string::~string((string *)&key);
  std::__cxx11::string::~string((string *)&xonly_hash);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,"and_b(after(100),a:after(1000000000))",
             (allocator<char> *)local_730);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&xonly_hash,"?",(allocator<char> *)&local_288);
  std::__cxx11::string::string<std::allocator<char>>((string *)&key,"?",&local_28d);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&MESSAGE_HASH,(string *)&xonly_hash
             ,(string *)&key,0xb);
  std::__cxx11::string::~string((string *)&key);
  std::__cxx11::string::~string((string *)&xonly_hash);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "thresh(2,ltv:after(1000000000),altv:after(100),a:pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65))"
             ,(allocator<char> *)local_730);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&xonly_hash,"?",(allocator<char> *)&local_288);
  std::__cxx11::string::string<std::allocator<char>>((string *)&key,"?",&local_28d);
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&MESSAGE_HASH,(string *)&xonly_hash
             ,(string *)&key,0xb);
  std::__cxx11::string::~string((string *)&key);
  std::__cxx11::string::~string((string *)&xonly_hash);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&MESSAGE_HASH,
             "thresh(1,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),altv:after(1000000000),altv:after(100))"
             ,(allocator<char> *)local_730);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&xonly_hash,"?",(allocator<char> *)&local_288);
  std::__cxx11::string::string<std::allocator<char>>((string *)&key,"?",&local_28d);
  __p = (pointer)&MESSAGE_HASH;
  anon_unknown.dwarf_9a1342::MiniScriptTest::Test
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)__p,(string *)&xonly_hash,
             (string *)&key,1);
  std::__cxx11::string::~string((string *)&key);
  std::__cxx11::string::~string((string *)&xonly_hash);
  std::__cxx11::string::~string((string *)&MESSAGE_HASH);
  std::
  unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
  ::reset((unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
           *)0x0,__p);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ms_ins.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ms_nondup.
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ms_dup4.
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ms_dup3.
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ms_dup2.
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ms_dup1.
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ms_minimalif.
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ms_multi.
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&nonminverify_script.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&nonminpush_script.super_CScriptBase)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ms_stack_nok.
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ms_stack_ok.
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&ms_stack_limit);
  std::__cxx11::string::~string((string *)&ms_str_multi_a);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(fixed_tests)
{
    g_testdata.reset(new TestData());

    // Validity rules
    Test("l:older(1)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // older(1): valid
    Test("l:older(0)", "?", "?", TESTMODE_INVALID); // older(0): k must be at least 1
    Test("l:older(2147483647)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // older(2147483647): valid
    Test("l:older(2147483648)", "?", "?", TESTMODE_INVALID); // older(2147483648): k must be below 2^31
    Test("u:after(1)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // after(1): valid
    Test("u:after(0)", "?", "?", TESTMODE_INVALID); // after(0): k must be at least 1
    Test("u:after(2147483647)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // after(2147483647): valid
    Test("u:after(2147483648)", "?", "?", TESTMODE_INVALID); // after(2147483648): k must be below 2^31
    Test("andor(0,1,1)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // andor(Bdu,B,B): valid
    Test("andor(a:0,1,1)", "?", "?", TESTMODE_INVALID); // andor(Wdu,B,B): X must be B
    Test("andor(0,a:1,a:1)", "?", "?", TESTMODE_INVALID); // andor(Bdu,W,W): Y and Z must be B/V/K
    Test("andor(1,1,1)", "?", "?", TESTMODE_INVALID); // andor(Bu,B,B): X must be d
    Test("andor(n:or_i(0,after(1)),1,1)", "?", "?", TESTMODE_VALID); // andor(Bdu,B,B): valid
    Test("andor(or_i(0,after(1)),1,1)", "?", "?", TESTMODE_INVALID); // andor(Bd,B,B): X must be u
    Test("c:andor(0,pk_k(03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7),pk_k(036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00))", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG); // andor(Bdu,K,K): valid
    Test("t:andor(0,v:1,v:1)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // andor(Bdu,V,V): valid
    Test("and_v(v:1,1)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // and_v(V,B): valid
    Test("t:and_v(v:1,v:1)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // and_v(V,V): valid
    Test("c:and_v(v:1,pk_k(036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00))", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG); // and_v(V,K): valid
    Test("and_v(1,1)", "?", "?", TESTMODE_INVALID); // and_v(B,B): X must be V
    Test("and_v(pk_k(02352bbf4a4cdd12564f93fa332ce333301d9ad40271f8107181340aef25be59d5),1)", "?", "?", TESTMODE_INVALID); // and_v(K,B): X must be V
    Test("and_v(v:1,a:1)", "?", "?", TESTMODE_INVALID); // and_v(K,W): Y must be B/V/K
    Test("and_b(1,a:1)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // and_b(B,W): valid
    Test("and_b(1,1)", "?", "?", TESTMODE_INVALID); // and_b(B,B): Y must W
    Test("and_b(v:1,a:1)", "?", "?", TESTMODE_INVALID); // and_b(V,W): X must be B
    Test("and_b(a:1,a:1)", "?", "?", TESTMODE_INVALID); // and_b(W,W): X must be B
    Test("and_b(pk_k(025601570cb47f238d2b0286db4a990fa0f3ba28d1a319f5e7cf55c2a2444da7cc),a:1)", "?", "?", TESTMODE_INVALID); // and_b(K,W): X must be B
    Test("or_b(0,a:0)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG); // or_b(Bd,Wd): valid
    Test("or_b(1,a:0)", "?", "?", TESTMODE_INVALID); // or_b(B,Wd): X must be d
    Test("or_b(0,a:1)", "?", "?", TESTMODE_INVALID); // or_b(Bd,W): Y must be d
    Test("or_b(0,0)", "?", "?", TESTMODE_INVALID); // or_b(Bd,Bd): Y must W
    Test("or_b(v:0,a:0)", "?", "?", TESTMODE_INVALID); // or_b(V,Wd): X must be B
    Test("or_b(a:0,a:0)", "?", "?", TESTMODE_INVALID); // or_b(Wd,Wd): X must be B
    Test("or_b(pk_k(025601570cb47f238d2b0286db4a990fa0f3ba28d1a319f5e7cf55c2a2444da7cc),a:0)", "?", "?", TESTMODE_INVALID); // or_b(Kd,Wd): X must be B
    Test("t:or_c(0,v:1)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // or_c(Bdu,V): valid
    Test("t:or_c(a:0,v:1)", "?", "?", TESTMODE_INVALID); // or_c(Wdu,V): X must be B
    Test("t:or_c(1,v:1)", "?", "?", TESTMODE_INVALID); // or_c(Bu,V): X must be d
    Test("t:or_c(n:or_i(0,after(1)),v:1)", "?", "?", TESTMODE_VALID); // or_c(Bdu,V): valid
    Test("t:or_c(or_i(0,after(1)),v:1)", "?", "?", TESTMODE_INVALID); // or_c(Bd,V): X must be u
    Test("t:or_c(0,1)", "?", "?", TESTMODE_INVALID); // or_c(Bdu,B): Y must be V
    Test("or_d(0,1)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // or_d(Bdu,B): valid
    Test("or_d(a:0,1)", "?", "?", TESTMODE_INVALID); // or_d(Wdu,B): X must be B
    Test("or_d(1,1)", "?", "?", TESTMODE_INVALID); // or_d(Bu,B): X must be d
    Test("or_d(n:or_i(0,after(1)),1)", "?", "?", TESTMODE_VALID); // or_d(Bdu,B): valid
    Test("or_d(or_i(0,after(1)),1)", "?", "?", TESTMODE_INVALID); // or_d(Bd,B): X must be u
    Test("or_d(0,v:1)", "?", "?", TESTMODE_INVALID); // or_d(Bdu,V): Y must be B
    Test("or_i(1,1)", "?", "?", TESTMODE_VALID); // or_i(B,B): valid
    Test("t:or_i(v:1,v:1)", "?", "?", TESTMODE_VALID); // or_i(V,V): valid
    Test("c:or_i(pk_k(03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7),pk_k(036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00))", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG); // or_i(K,K): valid
    Test("or_i(a:1,a:1)", "?", "?", TESTMODE_INVALID); // or_i(W,W): X and Y must be B/V/K
    Test("or_b(l:after(100),al:after(1000000000))", "?", "?", TESTMODE_VALID); // or_b(timelock, heighlock) valid
    Test("and_b(after(100),a:after(1000000000))", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_TIMELOCKMIX); // and_b(timelock, heighlock) invalid
    Test("pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65)", "2103d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac", "20d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG); // alias to c:pk_k
    Test("pkh(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65)", "76a914fcd35ddacad9f2d5be5e464639441c6065e6955d88ac", "76a914fd1690c37fa3b0f04395ddc9415b220ab1ccc59588ac", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG); // alias to c:pk_h

    // Randomly generated test set that covers the majority of type and node type combinations
    Test("lltvln:after(1231488000)", "6300676300676300670400046749b1926869516868", "=", TESTMODE_VALID | TESTMODE_NONMAL, 12, 3, 3, 3, 3);
    Test("uuj:and_v(v:multi(2,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a,025601570cb47f238d2b0286db4a990fa0f3ba28d1a319f5e7cf55c2a2444da7cc),after(1231488000))", "6363829263522103d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a21025601570cb47f238d2b0286db4a990fa0f3ba28d1a319f5e7cf55c2a2444da7cc52af0400046749b168670068670068", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG | TESTMODE_TAPSCRIPT_INVALID, 14, 5, 2 + 2 + 1 + 2 * 73, 0, 7);
    Test("or_b(un:multi(2,03daed4f2be3a8bf278e70132fb0beb7522f570e144bf615c07e996d443dee8729,024ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c97),al:older(16))", "63522103daed4f2be3a8bf278e70132fb0beb7522f570e144bf615c07e996d443dee872921024ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c9752ae926700686b63006760b2686c9b", "?", TESTMODE_VALID | TESTMODE_TAPSCRIPT_INVALID, 14, 5, 2 + 1 + 2 * 73 + 2, 0, 8);
    Test("j:and_v(vdv:after(1567547623),older(2016))", "829263766304e7e06e5db169686902e007b268", "=", TESTMODE_VALID | TESTMODE_NONMAL, 11, 1, 2, 2, 2);
    Test("t:and_v(vu:hash256(131772552c01444cd81360818376a040b7c3b2b7b0a53550ee3edde216cec61b),v:sha256(ec4916dd28fc4c10d78e287ca5d9cc51ee1ae73cbfde08c6b37324cbfaac8bc5))", "6382012088aa20131772552c01444cd81360818376a040b7c3b2b7b0a53550ee3edde216cec61b876700686982012088a820ec4916dd28fc4c10d78e287ca5d9cc51ee1ae73cbfde08c6b37324cbfaac8bc58851", "6382012088aa20131772552c01444cd81360818376a040b7c3b2b7b0a53550ee3edde216cec61b876700686982012088a820ec4916dd28fc4c10d78e287ca5d9cc51ee1ae73cbfde08c6b37324cbfaac8bc58851", TESTMODE_VALID | TESTMODE_NONMAL, 12, 3, 2 + 33 + 33, 2 + 33 + 33, 4);
    Test("t:andor(multi(3,02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e,03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556,02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13),v:older(4194305),v:sha256(9267d3dbed802941483f1afa2a6bc68de5f653128aca9bf1461c5d0a3ad36ed2))", "532102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e2103fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a14602975562102e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd1353ae6482012088a8209267d3dbed802941483f1afa2a6bc68de5f653128aca9bf1461c5d0a3ad36ed2886703010040b2696851", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_TAPSCRIPT_INVALID, 13, 5, 1 + 3 * 73, 0, 10);
    Test("or_d(multi(1,02f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9),or_b(multi(3,022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01,032fa2104d6b38d11b0230010559879124e42ab8dfeff5ff29dc9cdadd4ecacc3f,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a),su:after(500000)))", "512102f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f951ae73645321022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a0121032fa2104d6b38d11b0230010559879124e42ab8dfeff5ff29dc9cdadd4ecacc3f2103d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a53ae7c630320a107b16700689b68", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_TAPSCRIPT_INVALID, 15, 7, 2 + 1 + 3 * 73 + 1, 0, 10);
    Test("or_d(sha256(38df1c1f64a24a77b23393bca50dff872e31edc4f3b5aa3b90ad0b82f4f089b6),and_n(un:after(499999999),older(4194305)))", "82012088a82038df1c1f64a24a77b23393bca50dff872e31edc4f3b5aa3b90ad0b82f4f089b68773646304ff64cd1db19267006864006703010040b26868", "82012088a82038df1c1f64a24a77b23393bca50dff872e31edc4f3b5aa3b90ad0b82f4f089b68773646304ff64cd1db19267006864006703010040b26868", TESTMODE_VALID, 16, 1, 33, 33, 3);
    Test("and_v(or_i(v:multi(2,02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb),v:multi(2,03e60fce93b59e9ec53011aabc21c23e97b2a31369b87a5ae9c44ee89e2a6dec0a,025cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc)),sha256(d1ec675902ef1633427ca360b290b0b3045a0d9058ddb5e648b4c3c3224c5c68))", "63522102c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee52103774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb52af67522103e60fce93b59e9ec53011aabc21c23e97b2a31369b87a5ae9c44ee89e2a6dec0a21025cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc52af6882012088a820d1ec675902ef1633427ca360b290b0b3045a0d9058ddb5e648b4c3c3224c5c6887", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG | TESTMODE_TAPSCRIPT_INVALID, 11, 5, 2 + 1 + 2 * 73 + 33, 0, 8);
    Test("j:and_b(multi(2,0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798,024ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c97),s:or_i(older(1),older(4252898)))", "82926352210279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f8179821024ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c9752ae7c6351b26703e2e440b2689a68", "?", TESTMODE_VALID | TESTMODE_NEEDSIG | TESTMODE_TAPSCRIPT_INVALID, 14, 4, 1 + 2 * 73 + 2, 0, 8);
    Test("and_b(older(16),s:or_d(sha256(e38990d0c7fc009880a9c07c23842e886c6bbdc964ce6bdd5817ad357335ee6f),n:after(1567547623)))", "60b27c82012088a820e38990d0c7fc009880a9c07c23842e886c6bbdc964ce6bdd5817ad357335ee6f87736404e7e06e5db192689a", "=", TESTMODE_VALID, 12, 1, 33, 33, 4);
    Test("j:and_v(v:hash160(20195b5a3d650c17f0f29f91c33f8f6335193d07),or_d(sha256(96de8fc8c256fa1e1556d41af431cace7dca68707c78dd88c3acab8b17164c47),older(16)))", "82926382012088a91420195b5a3d650c17f0f29f91c33f8f6335193d078882012088a82096de8fc8c256fa1e1556d41af431cace7dca68707c78dd88c3acab8b17164c4787736460b26868", "=", TESTMODE_VALID, 16, 2, 33 + 33, 33 + 33, 4);
    Test("and_b(hash256(32ba476771d01e37807990ead8719f08af494723de1d228f2c2c07cc0aa40bac),a:and_b(hash256(131772552c01444cd81360818376a040b7c3b2b7b0a53550ee3edde216cec61b),a:older(1)))", "82012088aa2032ba476771d01e37807990ead8719f08af494723de1d228f2c2c07cc0aa40bac876b82012088aa20131772552c01444cd81360818376a040b7c3b2b7b0a53550ee3edde216cec61b876b51b26c9a6c9a", "=", TESTMODE_VALID | TESTMODE_NONMAL, 15, 2, 33 + 33, 33 + 33, 4);
    Test("thresh(2,multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00),a:multi(1,036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00),ac:pk_k(022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01))", "522103a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c721036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a0052ae6b5121036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a0051ae6c936b21022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01ac6c935287", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG | TESTMODE_TAPSCRIPT_INVALID, 13, 6, 1 + 2 * 73 + 1 + 73 + 1, 0, 10);
    Test("and_n(sha256(d1ec675902ef1633427ca360b290b0b3045a0d9058ddb5e648b4c3c3224c5c68),t:or_i(v:older(4252898),v:older(144)))", "82012088a820d1ec675902ef1633427ca360b290b0b3045a0d9058ddb5e648b4c3c3224c5c68876400676303e2e440b26967029000b269685168", "=", TESTMODE_VALID, 14, 2, 33 + 2, 33 + 2, 4);
    Test("or_d(nd:and_v(v:older(4252898),v:older(4252898)),sha256(38df1c1f64a24a77b23393bca50dff872e31edc4f3b5aa3b90ad0b82f4f089b6))", "766303e2e440b26903e2e440b2696892736482012088a82038df1c1f64a24a77b23393bca50dff872e31edc4f3b5aa3b90ad0b82f4f089b68768", "=", TESTMODE_VALID, 15, 2, 1 + 33, 1 + 33, 3);
    Test("c:and_v(or_c(sha256(9267d3dbed802941483f1afa2a6bc68de5f653128aca9bf1461c5d0a3ad36ed2),v:multi(1,02c44d12c7065d812e8acf28d7cbb19f9011ecd9e9fdf281b0e6a3b5e87d22e7db)),pk_k(03acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbe))", "82012088a8209267d3dbed802941483f1afa2a6bc68de5f653128aca9bf1461c5d0a3ad36ed28764512102c44d12c7065d812e8acf28d7cbb19f9011ecd9e9fdf281b0e6a3b5e87d22e7db51af682103acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbeac", "?", TESTMODE_VALID | TESTMODE_NEEDSIG | TESTMODE_TAPSCRIPT_INVALID, 8, 2, 33 + 73, 0, 4);
    Test("c:and_v(or_c(multi(2,036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a00,02352bbf4a4cdd12564f93fa332ce333301d9ad40271f8107181340aef25be59d5),v:ripemd160(1b0f3c404d12075c68c938f9f60ebea4f74941a0)),pk_k(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556))", "5221036d2b085e9e382ed10b69fc311a03f8641ccfff21574de0927513a49d9a688a002102352bbf4a4cdd12564f93fa332ce333301d9ad40271f8107181340aef25be59d552ae6482012088a6141b0f3c404d12075c68c938f9f60ebea4f74941a088682103fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ac", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG | TESTMODE_TAPSCRIPT_INVALID, 10, 5, 1 + 2 * 73 + 73, 0, 9);
    Test("and_v(andor(hash256(8a35d9ca92a48eaade6f53a64985e9e2afeb74dcf8acb4c3721e0dc7e4294b25),v:hash256(939894f70e6c3a25da75da0cc2071b4076d9b006563cf635986ada2e93c0d735),v:older(50000)),after(499999999))", "82012088aa208a35d9ca92a48eaade6f53a64985e9e2afeb74dcf8acb4c3721e0dc7e4294b2587640350c300b2696782012088aa20939894f70e6c3a25da75da0cc2071b4076d9b006563cf635986ada2e93c0d735886804ff64cd1db1", "=", TESTMODE_VALID, 14, 2, 33 + 33, 33 + 33, 4);
    Test("andor(hash256(5f8d30e655a7ba0d7596bb3ddfb1d2d20390d23b1845000e1e118b3be1b3f040),j:and_v(v:hash160(3a2bff0da9d96868e66abc4427bea4691cf61ccd),older(4194305)),ripemd160(44d90e2d3714c8663b632fcf0f9d5f22192cc4c8))", "82012088aa205f8d30e655a7ba0d7596bb3ddfb1d2d20390d23b1845000e1e118b3be1b3f040876482012088a61444d90e2d3714c8663b632fcf0f9d5f22192cc4c8876782926382012088a9143a2bff0da9d96868e66abc4427bea4691cf61ccd8803010040b26868", "=", TESTMODE_VALID, 20, 2, 33 + 33, 33 + 33, 4);
    Test("or_i(c:and_v(v:after(500000),pk_k(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)),sha256(d9147961436944f43cd99d28b2bbddbf452ef872b30c8279e255e7daafc7f946))", "630320a107b1692102c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5ac6782012088a820d9147961436944f43cd99d28b2bbddbf452ef872b30c8279e255e7daafc7f9468768", "630320a107b16920c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5ac6782012088a820d9147961436944f43cd99d28b2bbddbf452ef872b30c8279e255e7daafc7f9468768", TESTMODE_VALID | TESTMODE_NONMAL, 10, 2, 2 + 73, 2 + 66, 3);
    Test("thresh(2,c:pk_h(025cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc),s:sha256(e38990d0c7fc009880a9c07c23842e886c6bbdc964ce6bdd5817ad357335ee6f),a:hash160(dd69735817e0e3f6f826a9238dc2e291184f0131))", "76a9145dedfbf9ea599dd4e3ca6a80b333c472fd0b3f6988ac7c82012088a820e38990d0c7fc009880a9c07c23842e886c6bbdc964ce6bdd5817ad357335ee6f87936b82012088a914dd69735817e0e3f6f826a9238dc2e291184f0131876c935287", "76a9141a7ac36cfa8431ab2395d701b0050045ae4a37d188ac7c82012088a820e38990d0c7fc009880a9c07c23842e886c6bbdc964ce6bdd5817ad357335ee6f87936b82012088a914dd69735817e0e3f6f826a9238dc2e291184f0131876c935287", TESTMODE_VALID, 18, 4, 1 + 34 + 33 + 33, 1 + 33 + 33 + 33, 6);
    Test("and_n(sha256(9267d3dbed802941483f1afa2a6bc68de5f653128aca9bf1461c5d0a3ad36ed2),uc:and_v(v:older(144),pk_k(03fe72c435413d33d48ac09c9161ba8b09683215439d62b7940502bda8b202e6ce)))", "82012088a8209267d3dbed802941483f1afa2a6bc68de5f653128aca9bf1461c5d0a3ad36ed28764006763029000b2692103fe72c435413d33d48ac09c9161ba8b09683215439d62b7940502bda8b202e6ceac67006868", "82012088a8209267d3dbed802941483f1afa2a6bc68de5f653128aca9bf1461c5d0a3ad36ed28764006763029000b26920fe72c435413d33d48ac09c9161ba8b09683215439d62b7940502bda8b202e6ceac67006868", TESTMODE_VALID | TESTMODE_NEEDSIG, 13, 3, 33 + 2 + 73, 33 + 2 + 66, 5);
    Test("and_n(c:pk_k(03daed4f2be3a8bf278e70132fb0beb7522f570e144bf615c07e996d443dee8729),and_b(l:older(4252898),a:older(16)))", "2103daed4f2be3a8bf278e70132fb0beb7522f570e144bf615c07e996d443dee8729ac64006763006703e2e440b2686b60b26c9a68", "20daed4f2be3a8bf278e70132fb0beb7522f570e144bf615c07e996d443dee8729ac64006763006703e2e440b2686b60b26c9a68", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG | TESTMODE_TIMELOCKMIX, 12, 2, 73 + 1, 66 + 1, 3);
    Test("c:or_i(and_v(v:older(16),pk_h(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e)),pk_h(026a245bf6dc698504c89a20cfded60853152b695336c28063b61c65cbd269e6b4))", "6360b26976a9149fc5dbe5efdce10374a4dd4053c93af540211718886776a9142fbd32c8dd59ee7c17e66cb6ebea7e9846c3040f8868ac", "6360b26976a9144d4421361c3289bdad06441ffaee8be8e786f1ad886776a91460d4a7bcbd08f58e58bd208d1069837d7adb16ae8868ac", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG, 12, 3, 2 + 34 + 73, 2 + 33 + 66, 4);
    Test("or_d(c:pk_h(02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13),andor(c:pk_k(024ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c97),older(2016),after(1567547623)))", "76a914c42e7ef92fdb603af844d064faad95db9bcdfd3d88ac736421024ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c97ac6404e7e06e5db16702e007b26868", "76a91421ab1a140d0d305b8ff62bdb887d9fef82c9899e88ac7364204ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c97ac6404e7e06e5db16702e007b26868", TESTMODE_VALID | TESTMODE_NONMAL, 13, 3, 1 + 34 + 73, 1 + 33 + 66, 5);
    Test("c:andor(ripemd160(6ad07d21fd5dfc646f0b30577045ce201616b9ba),pk_h(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e),and_v(v:hash256(8a35d9ca92a48eaade6f53a64985e9e2afeb74dcf8acb4c3721e0dc7e4294b25),pk_h(03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a)))", "82012088a6146ad07d21fd5dfc646f0b30577045ce201616b9ba876482012088aa208a35d9ca92a48eaade6f53a64985e9e2afeb74dcf8acb4c3721e0dc7e4294b258876a914dd100be7d9aea5721158ebde6d6a1fd8fff93bb1886776a9149fc5dbe5efdce10374a4dd4053c93af5402117188868ac", "82012088a6146ad07d21fd5dfc646f0b30577045ce201616b9ba876482012088aa208a35d9ca92a48eaade6f53a64985e9e2afeb74dcf8acb4c3721e0dc7e4294b258876a914a63d1e4d2ed109246c600ec8c19cce546b65b1cc886776a9144d4421361c3289bdad06441ffaee8be8e786f1ad8868ac", TESTMODE_VALID | TESTMODE_NEEDSIG, 18, 3, 33 + 34 + 73, 33 + 33 + 66, 5);
    Test("c:andor(u:ripemd160(6ad07d21fd5dfc646f0b30577045ce201616b9ba),pk_h(03daed4f2be3a8bf278e70132fb0beb7522f570e144bf615c07e996d443dee8729),or_i(pk_h(022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01),pk_h(0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798)))", "6382012088a6146ad07d21fd5dfc646f0b30577045ce201616b9ba87670068646376a9149652d86bedf43ad264362e6e6eba6eb764508127886776a914751e76e8199196d454941c45d1b3a323f1433bd688686776a91420d637c1a6404d2227f3561fdbaff5a680dba6488868ac", "6382012088a6146ad07d21fd5dfc646f0b30577045ce201616b9ba87670068646376a914ceedcb44b38bdbcb614d872223964fd3dca8a434886776a914f678d9b79045452c8c64e9309d0f0046056e26c588686776a914a2a75e1819afa208f6c89ae0da43021116dfcb0c8868ac", TESTMODE_VALID | TESTMODE_NEEDSIG, 23, 4, 2 + 33 + 34 + 73, 2 + 33 + 33 + 66, 5);
    Test("c:or_i(andor(c:pk_h(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),pk_h(022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01),pk_h(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)),pk_k(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e))", "6376a914fcd35ddacad9f2d5be5e464639441c6065e6955d88ac6476a91406afd46bcdfd22ef94ac122aa11f241244a37ecc886776a9149652d86bedf43ad264362e6e6eba6eb7645081278868672102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e68ac", "6376a914fd1690c37fa3b0f04395ddc9415b220ab1ccc59588ac6476a9149b652a14674a506079f574d20ca7daef6f9a66bb886776a914ceedcb44b38bdbcb614d872223964fd3dca8a43488686720d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e68ac", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG, 17, 5, 2 + 34 + 73 + 34 + 73, 2 + 33 + 66 + 33 + 66, 6);
    Test("thresh(1,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),altv:after(1000000000),altv:after(100))", "2103d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac6b6300670400ca9a3bb16951686c936b6300670164b16951686c935187", "20d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac6b6300670400ca9a3bb16951686c936b6300670164b16951686c935187", TESTMODE_VALID, 18, 3, 73 + 2 + 2, 66 + 2 + 2, 4);
    Test("thresh(2,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),ac:pk_k(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556),altv:after(1000000000),altv:after(100))", "2103d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac6b2103fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ac6c936b6300670400ca9a3bb16951686c936b6300670164b16951686c935287", "20d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac6b20fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ac6c936b6300670400ca9a3bb16951686c936b6300670164b16951686c935287", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_TIMELOCKMIX, 22, 4, 73 + 73 + 2 + 2, 66 + 66 + 2 + 2, 5);

    // Additional Tapscript-related tests
    // Edge cases when parsing multi_a from script:
    //  - no pubkey at all
    //  - no pubkey before a CHECKSIGADD
    //  - no pubkey before the CHECKSIG
    constexpr KeyConverter tap_converter{miniscript::MiniscriptContext::TAPSCRIPT};
    constexpr KeyConverter wsh_converter{miniscript::MiniscriptContext::P2WSH};
    const auto no_pubkey{"ac519c"_hex_u8};
    BOOST_CHECK(miniscript::FromScript({no_pubkey.begin(), no_pubkey.end()}, tap_converter) == nullptr);
    const auto incomplete_multi_a{"ba20c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5ba519c"_hex_u8};
    BOOST_CHECK(miniscript::FromScript({incomplete_multi_a.begin(), incomplete_multi_a.end()}, tap_converter) == nullptr);
    const auto incomplete_multi_a_2{"ac2079be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798ac20c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5ba519c"_hex_u8};
    BOOST_CHECK(miniscript::FromScript({incomplete_multi_a_2.begin(), incomplete_multi_a_2.end()}, tap_converter) == nullptr);
    // Can use multi_a under Tapscript but not P2WSH.
    Test("and_v(v:multi_a(2,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a,025601570cb47f238d2b0286db4a990fa0f3ba28d1a319f5e7cf55c2a2444da7cc),after(1231488000))", "?", "20d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85aac205601570cb47f238d2b0286db4a990fa0f3ba28d1a319f5e7cf55c2a2444da7ccba529d0400046749b1", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG | TESTMODE_P2WSH_INVALID, 4, 2, {}, {}, 3);
    // Can use more than 20 keys in a multi_a.
    std::string ms_str_multi_a{"multi_a(1,"};
    for (size_t i = 0; i < 21; ++i) {
        ms_str_multi_a += HexStr(g_testdata->pubkeys[i]);
        if (i < 20) ms_str_multi_a += ",";
    }
    ms_str_multi_a += ")";
    Test(ms_str_multi_a, "?", "2079be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798ac20c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5ba20f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9ba20e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13ba202f8bde4d1a07209355b4a7250a5c5128e88b84bddc619ab7cba8d569b240efe4ba20fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ba205cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bcba202f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01ba20acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbeba20a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7ba20774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cbba20d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85aba20f28773c2d975288bc7d1d205c3748651b075fbc6610e58cddeeddf8f19405aa8ba20499fdf9e895e719cfd64e67f07d38e3226aa7b63678949e6e49b241a60e823e4ba20d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080eba20e60fce93b59e9ec53011aabc21c23e97b2a31369b87a5ae9c44ee89e2a6dec0aba20defdea4cdb677750a420fee807eacf21eb9898ae79b9768766e4faa04a2d4a34ba205601570cb47f238d2b0286db4a990fa0f3ba28d1a319f5e7cf55c2a2444da7ccba202b4ea0a797a443d293ef5cff444f4979f06acfebd7e86d277475656138385b6cba204ce119c96e2fa357200b559b2f7dd5a5f02d5290aff74b03f3e471b273211c97ba20352bbf4a4cdd12564f93fa332ce333301d9ad40271f8107181340aef25be59d5ba519c", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG | TESTMODE_P2WSH_INVALID, 22, 21, {}, {}, 22);
    // Since 'd:' is 'u' we can use it directly inside a thresh. But we can't under P2WSH.
    Test("thresh(2,dv:older(42),s:pk(025cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc),s:pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65))", "?", "7663012ab269687c205cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bcac937c20d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac935287", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG | TESTMODE_P2WSH_INVALID, 12, 3, {}, {}, 4);
    // We can have a script that has more than 201 ops (n = 99), that needs a stack size > 100 (n = 110), or has a
    // script that is larger than 3600 bytes (n = 200). All that can't be under P2WSH.
    for (const auto pk_count: {99, 110, 200}) {
        std::string ms_str_large;
        for (auto i = 0; i < pk_count - 1; ++i) {
            ms_str_large += "and_b(pk(" + HexStr(g_testdata->pubkeys[i]) + "),a:";
        }
        ms_str_large += "pk(" + HexStr(g_testdata->pubkeys[pk_count - 1]) + ")";
        ms_str_large.insert(ms_str_large.end(), pk_count - 1, ')');
        Test(ms_str_large, "?", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG | TESTMODE_P2WSH_INVALID, pk_count + (pk_count - 1) * 3, pk_count, {}, {}, pk_count + 1);
    }
    // We can have a script that reaches a stack size of 1000 during execution.
    std::string ms_stack_limit;
    auto count{998};
    for (auto i = 0; i < count; ++i) {
        ms_stack_limit += "and_b(older(1),a:";
    }
    ms_stack_limit += "pk(" + HexStr(g_testdata->pubkeys[0]) + ")";
    ms_stack_limit.insert(ms_stack_limit.end(), count, ')');
    const auto ms_stack_ok{miniscript::FromString(ms_stack_limit, tap_converter)};
    BOOST_CHECK(ms_stack_ok && ms_stack_ok->CheckStackSize());
    Test(ms_stack_limit, "?", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG | TESTMODE_P2WSH_INVALID, 4 * count + 1, 1, {}, {}, 1 + count + 1);
    // But one more element on the stack during execution will make it fail. And we'd detect that.
    count++;
    ms_stack_limit = "and_b(older(1),a:" + ms_stack_limit + ")";
    const auto ms_stack_nok{miniscript::FromString(ms_stack_limit, tap_converter)};
    BOOST_CHECK(ms_stack_nok && !ms_stack_nok->CheckStackSize());
    Test(ms_stack_limit, "?", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_NEEDSIG | TESTMODE_P2WSH_INVALID, 4 * count + 1, 1, {}, {}, 1 + count + 1);

    // Misc unit tests
    // A Script with a non minimal push is invalid
    constexpr auto nonminpush{"0000210232780000feff00ffffffffffff21ff005f00ae21ae00000000060602060406564c2102320000060900fe00005f00ae21ae00100000060606060606000000000000000000000000000000000000000000000000000000000000000000"_hex_u8};
    const CScript nonminpush_script(nonminpush.begin(), nonminpush.end());
    BOOST_CHECK(miniscript::FromScript(nonminpush_script, wsh_converter) == nullptr);
    BOOST_CHECK(miniscript::FromScript(nonminpush_script, tap_converter) == nullptr);
    // A non-minimal VERIFY (<key> CHECKSIG VERIFY 1)
    constexpr auto nonminverify{"2103a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7ac6951"_hex_u8};
    const CScript nonminverify_script(nonminverify.begin(), nonminverify.end());
    BOOST_CHECK(miniscript::FromScript(nonminverify_script, wsh_converter) == nullptr);
    BOOST_CHECK(miniscript::FromScript(nonminverify_script, tap_converter) == nullptr);
    // A threshold as large as the number of subs is valid.
    Test("thresh(2,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),altv:after(100))", "2103d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac6b6300670164b16951686c935287", "20d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac6b6300670164b16951686c935287", TESTMODE_VALID | TESTMODE_NEEDSIG | TESTMODE_NONMAL);
    // A threshold of 1 is valid.
    Test("thresh(1,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),sc:pk_k(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556))", "2103d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac7c2103fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ac935187", "20d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac7c20fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ac935187", TESTMODE_VALID | TESTMODE_NEEDSIG | TESTMODE_NONMAL);
    // A threshold with a k larger than the number of subs is invalid
    Test("thresh(3,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),sc:pk_k(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556))", "2103d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac7c2103fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ac935187", "=", TESTMODE_INVALID);
    // A threshold with a k null is invalid
    Test("thresh(0,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),sc:pk_k(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556))", "2103d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65ac7c2103fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556ac935187", "=", TESTMODE_INVALID);
    // For CHECKMULTISIG the OP cost is the number of keys, but the stack size is the number of sigs (+1)
    const auto ms_multi = miniscript::FromString("multi(1,03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65,03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556,0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798)", wsh_converter);
    BOOST_CHECK(ms_multi);
    BOOST_CHECK_EQUAL(*ms_multi->GetOps(), 4); // 3 pubkeys + CMS
    BOOST_CHECK_EQUAL(*ms_multi->GetStackSize(), 2); // 1 sig + dummy elem
    // The 'd:' wrapper leaves on the stack what was DUP'ed at the beginning of its execution.
    // Since it contains an OP_IF just after on the same element, we can make sure that the element
    // in question must be OP_1 if OP_IF enforces that its argument must only be OP_1 or the empty
    // vector (since otherwise the execution would immediately fail). This is the MINIMALIF rule.
    // Unfortunately, this rule is consensus for Taproot but only policy for P2WSH. Therefore we can't
    // (for now) have 'd:' be 'u'. This tests we can't use a 'd:' wrapper for a thresh, which requires
    // its subs to all be 'u' (taken from https://github.com/rust-bitcoin/rust-miniscript/discussions/341).
    const auto ms_minimalif = miniscript::FromString("thresh(3,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),sc:pk_k(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556),sc:pk_k(0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798),sdv:older(32))", wsh_converter);
    BOOST_CHECK(ms_minimalif && !ms_minimalif->IsValid());
    // A Miniscript with duplicate keys is not sane
    const auto ms_dup1 = miniscript::FromString("and_v(v:pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65))", wsh_converter);
    BOOST_CHECK(ms_dup1);
    BOOST_CHECK(!ms_dup1->IsSane() && !ms_dup1->CheckDuplicateKey());
    // Same with a disjunction, and different key nodes (pk and pkh)
    const auto ms_dup2 = miniscript::FromString("or_b(c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),ac:pk_h(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65))", wsh_converter);
    BOOST_CHECK(ms_dup2 && !ms_dup2->IsSane() && !ms_dup2->CheckDuplicateKey());
    // Same when the duplicates are leaves or a larger tree
    const auto ms_dup3 = miniscript::FromString("or_i(and_b(pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),s:pk(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556)),and_b(older(1),s:pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65)))", wsh_converter);
    BOOST_CHECK(ms_dup3 && !ms_dup3->IsSane() && !ms_dup3->CheckDuplicateKey());
    // Same when the duplicates are on different levels in the tree
    const auto ms_dup4 = miniscript::FromString("thresh(2,pkh(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),s:pk(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556),a:and_b(dv:older(1),s:pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65)))", wsh_converter);
    BOOST_CHECK(ms_dup4 && !ms_dup4->IsSane() && !ms_dup4->CheckDuplicateKey());
    // Sanity check the opposite is true, too. An otherwise sane Miniscript with no duplicate keys is sane.
    const auto ms_nondup = miniscript::FromString("pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65)", wsh_converter);
    BOOST_CHECK(ms_nondup && ms_nondup->CheckDuplicateKey() && ms_nondup->IsSane());
    // Test we find the first insane sub closer to be a leaf node. This fragment is insane for two reasons:
    // 1. It can be spent without a signature
    // 2. It contains timelock mixes
    // We'll report the timelock mix error, as it's "deeper" (closer to be a leaf node) than the "no 's' property"
    // error is.
    const auto ms_ins = miniscript::FromString("or_i(and_b(after(1),a:after(1000000000)),pk(03cdabb7f2dce7bfbd8a0b9570c6fd1e712e5d64045e9d6b517b3d5072251dc204))", wsh_converter);
    BOOST_CHECK(ms_ins && ms_ins->IsValid() && !ms_ins->IsSane());
    const auto insane_sub = ms_ins->FindInsaneSub();
    BOOST_CHECK(insane_sub && *insane_sub->ToString(wsh_converter) == "and_b(after(1),a:after(1000000000))");

    // Numbers can't be prefixed by a sign.
    BOOST_CHECK(!miniscript::FromString("after(-1)", wsh_converter));
    BOOST_CHECK(!miniscript::FromString("after(+1)", wsh_converter));
    BOOST_CHECK(!miniscript::FromString("thresh(-1,pk(03cdabb7f2dce7bfbd8a0b9570c6fd1e712e5d64045e9d6b517b3d5072251dc204))", wsh_converter));
    BOOST_CHECK(!miniscript::FromString("multi(+1,03cdabb7f2dce7bfbd8a0b9570c6fd1e712e5d64045e9d6b517b3d5072251dc204)", wsh_converter));

    // Timelock tests
    Test("after(100)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // only heightlock
    Test("after(1000000000)", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL); // only timelock
    Test("or_b(l:after(100),al:after(1000000000))", "?", "?", TESTMODE_VALID); // or_b(timelock, heighlock) valid
    Test("and_b(after(100),a:after(1000000000))", "?", "?", TESTMODE_VALID | TESTMODE_NONMAL | TESTMODE_TIMELOCKMIX); // and_b(timelock, heighlock) invalid
    /* This is correctly detected as non-malleable but for the wrong reason. The type system assumes that branches 1 and 2
       can be spent together to create a non-malleble witness, but because of mixing of timelocks they cannot be spent together.
       But since exactly one of the two after's can be satisfied, the witness involving the key cannot be malleated.
    */
    Test("thresh(2,ltv:after(1000000000),altv:after(100),a:pk(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65))", "?", "?", TESTMODE_VALID | TESTMODE_TIMELOCKMIX | TESTMODE_NONMAL); // thresh with k = 2
    // This is actually non-malleable in practice, but we cannot detect it in type system. See above rationale
    Test("thresh(1,c:pk_k(03d30199d74fb5a22d47b6e054e2f378cedacffcb89904a61d75d0dbd407143e65),altv:after(1000000000),altv:after(100))", "?", "?", TESTMODE_VALID); // thresh with k = 1

    g_testdata.reset();
}